

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_pack8.h
# Opt level: O1

void ncnn::convdw3x3s1_pack8_avx(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  void *pvVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float *pfVar224;
  float *pfVar225;
  float *pfVar226;
  long lVar227;
  int iVar228;
  float *pfVar229;
  float *pfVar230;
  int iVar231;
  long lVar232;
  uint uVar233;
  uint uVar234;
  uint uVar235;
  long lVar236;
  float *pfVar237;
  float *pfVar238;
  float *pfVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  float in_register_000012dc;
  float fVar245;
  float fVar246;
  float fVar247;
  float in_register_0000135c;
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  float in_register_0000139c;
  float fVar252;
  float fVar253;
  float in_register_000013dc;
  float fVar254;
  float fVar255;
  float fVar256;
  float fVar257;
  float fVar258;
  float in_register_0000141c;
  float fVar259;
  float in_register_0000145c;
  float in_register_0000149c;
  float fVar260;
  float in_register_000014dc;
  float fVar261;
  float fVar262;
  float fVar263;
  float fVar264;
  float in_register_0000151c;
  float fVar265;
  float fVar266;
  float in_register_0000155c;
  float in_register_0000159c;
  float fVar267;
  float fVar268;
  float fVar269;
  float fVar270;
  float fVar271;
  float fVar272;
  float fVar273;
  float fVar274;
  float fVar275;
  
  iVar6 = bottom_blob->c;
  if (0 < (long)iVar6) {
    uVar7 = top_blob->w;
    uVar8 = top_blob->h;
    pvVar9 = _bias->data;
    lVar1 = (long)bottom_blob->w * 8 + 0x10;
    lVar227 = 0;
    do {
      if (pvVar9 == (void *)0x0) {
        fVar267 = 0.0;
        fVar268 = 0.0;
        fVar269 = 0.0;
        fVar270 = 0.0;
        fVar271 = 0.0;
        fVar272 = 0.0;
        fVar273 = 0.0;
        fVar274 = 0.0;
      }
      else {
        pfVar229 = (float *)((long)pvVar9 + lVar227 * 0x20);
        fVar267 = *pfVar229;
        fVar268 = pfVar229[1];
        fVar269 = pfVar229[2];
        fVar270 = pfVar229[3];
        fVar271 = pfVar229[4];
        fVar272 = pfVar229[5];
        fVar273 = pfVar229[6];
        fVar274 = pfVar229[7];
      }
      pfVar237 = (float *)(top_blob->cstep * lVar227 * top_blob->elemsize + (long)top_blob->data);
      pfVar238 = (float *)(kernel->w * lVar227 * kernel->elemsize + (long)kernel->data);
      pfVar229 = (float *)(bottom_blob->cstep * lVar227 * bottom_blob->elemsize +
                          (long)bottom_blob->data);
      lVar232 = (long)bottom_blob->w * bottom_blob->elemsize;
      pfVar224 = (float *)(lVar232 + (long)pfVar229);
      pfVar225 = (float *)(lVar232 * 2 + (long)pfVar229);
      uVar233 = 0;
      if (1 < (int)uVar8) {
        lVar232 = lVar232 * 3 + (long)pfVar229;
        pfVar239 = (float *)(top_blob->elemsize * (long)top_blob->w + (long)pfVar237);
        iVar231 = 0;
        do {
          if ((int)uVar7 < 4) {
            uVar233 = 0;
          }
          else {
            iVar228 = 3;
            lVar236 = 0;
            do {
              pfVar226 = (float *)((long)pfVar229 + lVar236 + 0x20);
              fVar10 = *pfVar226;
              fVar11 = pfVar226[1];
              fVar12 = pfVar226[2];
              fVar13 = pfVar226[3];
              fVar14 = pfVar226[4];
              fVar15 = pfVar226[5];
              fVar16 = pfVar226[6];
              pfVar230 = (float *)((long)pfVar229 + lVar236 + 0x40);
              fVar17 = *pfVar230;
              fVar18 = pfVar230[1];
              fVar19 = pfVar230[2];
              fVar20 = pfVar230[3];
              fVar21 = pfVar230[4];
              fVar22 = pfVar230[5];
              fVar23 = pfVar230[6];
              pfVar2 = (float *)((long)pfVar229 + lVar236 + 0x60);
              fVar24 = *pfVar2;
              fVar25 = pfVar2[1];
              fVar26 = pfVar2[2];
              fVar27 = pfVar2[3];
              fVar28 = pfVar2[4];
              fVar29 = pfVar2[5];
              fVar30 = pfVar2[6];
              fVar31 = pfVar2[7];
              pfVar2 = (float *)((long)pfVar229 + lVar236 + 0x80);
              fVar32 = *pfVar2;
              fVar33 = pfVar2[1];
              fVar34 = pfVar2[2];
              fVar35 = pfVar2[3];
              fVar36 = pfVar2[4];
              fVar37 = pfVar2[5];
              fVar38 = pfVar2[6];
              fVar39 = *pfVar238;
              fVar40 = pfVar238[1];
              fVar41 = pfVar238[2];
              fVar42 = pfVar238[3];
              fVar43 = pfVar238[4];
              fVar44 = pfVar238[5];
              fVar45 = pfVar238[6];
              fVar46 = pfVar238[8];
              fVar47 = pfVar238[9];
              fVar48 = pfVar238[10];
              fVar49 = pfVar238[0xb];
              fVar50 = pfVar238[0xc];
              fVar51 = pfVar238[0xd];
              fVar52 = pfVar238[0xe];
              fVar53 = pfVar238[0x10];
              fVar54 = pfVar238[0x11];
              fVar55 = pfVar238[0x12];
              fVar56 = pfVar238[0x13];
              fVar57 = pfVar238[0x14];
              fVar58 = pfVar238[0x15];
              fVar59 = pfVar238[0x16];
              fVar60 = pfVar238[0x18];
              fVar61 = pfVar238[0x19];
              fVar62 = pfVar238[0x1a];
              fVar63 = pfVar238[0x1b];
              fVar64 = pfVar238[0x1c];
              fVar65 = pfVar238[0x1d];
              fVar66 = pfVar238[0x1e];
              pfVar4 = (float *)((long)pfVar229 + lVar236);
              fVar67 = pfVar4[1];
              fVar68 = pfVar4[2];
              fVar69 = pfVar4[3];
              fVar70 = pfVar4[4];
              fVar71 = pfVar4[5];
              fVar72 = pfVar4[6];
              fVar240 = in_register_0000141c + fVar274 + pfVar226[7] + pfVar230[7];
              fVar241 = in_register_0000145c + fVar274 + in_register_0000151c + fVar240;
              fVar242 = in_register_0000149c + fVar274 + in_register_0000155c + fVar241;
              pfVar226 = (float *)((long)pfVar229 + lVar236 + 0xa0);
              fVar73 = *pfVar226;
              fVar74 = pfVar226[1];
              fVar75 = pfVar226[2];
              fVar76 = pfVar226[3];
              fVar77 = pfVar226[4];
              fVar78 = pfVar226[5];
              fVar79 = pfVar226[6];
              fVar243 = in_register_000014dc + fVar274 + in_register_0000159c + fVar242;
              fVar80 = pfVar238[0x20];
              fVar81 = pfVar238[0x21];
              fVar82 = pfVar238[0x22];
              fVar83 = pfVar238[0x23];
              fVar84 = pfVar238[0x24];
              fVar85 = pfVar238[0x25];
              fVar86 = pfVar238[0x26];
              pfVar226 = (float *)((long)pfVar224 + lVar236);
              fVar87 = *pfVar226;
              fVar88 = pfVar226[1];
              fVar89 = pfVar226[2];
              fVar90 = pfVar226[3];
              fVar91 = pfVar226[4];
              fVar92 = pfVar226[5];
              fVar93 = pfVar226[6];
              pfVar230 = (float *)((long)pfVar224 + lVar236 + 0x20);
              fVar94 = *pfVar230;
              fVar95 = pfVar230[1];
              fVar96 = pfVar230[2];
              fVar97 = pfVar230[3];
              fVar98 = pfVar230[4];
              fVar99 = pfVar230[5];
              fVar100 = pfVar230[6];
              fVar101 = pfVar230[7];
              pfVar230 = (float *)((long)pfVar224 + lVar236 + 0x40);
              fVar102 = *pfVar230;
              fVar103 = pfVar230[1];
              fVar104 = pfVar230[2];
              fVar105 = pfVar230[3];
              fVar106 = pfVar230[4];
              fVar107 = pfVar230[5];
              fVar108 = pfVar230[6];
              pfVar230 = (float *)((long)pfVar224 + lVar236 + 0x60);
              fVar109 = *pfVar230;
              fVar110 = pfVar230[1];
              fVar111 = pfVar230[2];
              fVar255 = pfVar230[3];
              fVar257 = pfVar230[4];
              fVar112 = pfVar230[5];
              fVar113 = pfVar230[6];
              fVar259 = in_register_0000141c + fVar274 + fVar243;
              pfVar2 = (float *)((long)pfVar224 + lVar236 + 0x80);
              fVar114 = *pfVar2;
              fVar115 = pfVar2[1];
              fVar116 = pfVar2[2];
              fVar117 = pfVar2[3];
              fVar118 = pfVar2[4];
              fVar119 = pfVar2[5];
              fVar120 = pfVar2[6];
              fVar265 = pfVar226[7] + fVar274;
              fVar261 = fVar265 + in_register_0000155c + in_register_000014dc + fVar274;
              fVar262 = fVar261 + fVar265;
              fVar254 = fVar265 + fVar274 + fVar262 + fVar265;
              pfVar226 = (float *)((long)pfVar224 + lVar236 + 0xa0);
              fVar265 = *pfVar226;
              fVar121 = pfVar226[1];
              fVar122 = pfVar226[2];
              fVar123 = pfVar226[3];
              fVar124 = pfVar226[4];
              fVar125 = pfVar226[5];
              fVar126 = pfVar226[6];
              fVar246 = pfVar238[0xf] + pfVar238[0x17];
              fVar127 = pfVar238[0x28];
              fVar128 = pfVar238[0x29];
              fVar129 = pfVar238[0x2a];
              fVar130 = pfVar238[0x2b];
              fVar131 = pfVar238[0x2c];
              fVar132 = pfVar238[0x2d];
              fVar133 = pfVar238[0x2e];
              fVar134 = pfVar238[0x2f];
              fVar248 = fVar31 + fVar243 + pfVar238[0xf];
              fVar242 = fVar243 + fVar31 + pfVar2[7] + fVar242;
              fVar244 = in_register_0000155c + fVar31 + fVar242 + fVar243;
              pfVar226 = (float *)((long)pfVar225 + lVar236);
              fVar135 = *pfVar226;
              fVar136 = pfVar226[1];
              fVar137 = pfVar226[2];
              fVar253 = pfVar226[3];
              fVar138 = pfVar226[4];
              fVar139 = pfVar226[5];
              fVar140 = pfVar226[6];
              fVar141 = pfVar226[7];
              pfVar226 = (float *)((long)pfVar225 + lVar236 + 0x20);
              fVar142 = *pfVar226;
              fVar143 = pfVar226[1];
              fVar144 = pfVar226[2];
              fVar145 = pfVar226[3];
              fVar146 = pfVar226[4];
              fVar147 = pfVar226[5];
              fVar148 = pfVar226[6];
              pfVar2 = (float *)((long)pfVar225 + lVar236 + 0x40);
              fVar149 = *pfVar2;
              fVar150 = pfVar2[1];
              fVar151 = pfVar2[2];
              fVar152 = pfVar2[3];
              fVar153 = pfVar2[4];
              fVar154 = pfVar2[5];
              fVar155 = pfVar2[6];
              fVar275 = pfVar230[7] + fVar244;
              pfVar3 = (float *)((long)pfVar225 + lVar236 + 0x60);
              fVar156 = *pfVar3;
              fVar157 = pfVar3[1];
              fVar158 = pfVar3[2];
              fVar159 = pfVar3[3];
              fVar160 = pfVar3[4];
              fVar251 = pfVar3[5];
              fVar161 = pfVar3[6];
              pfVar5 = (float *)((long)pfVar225 + lVar236 + 0x80);
              fVar162 = *pfVar5;
              fVar163 = pfVar5[1];
              fVar164 = pfVar5[2];
              fVar165 = pfVar5[3];
              fVar166 = pfVar5[4];
              fVar167 = pfVar5[5];
              fVar168 = pfVar5[6];
              fVar169 = pfVar5[7];
              fVar170 = pfVar238[0x30];
              fVar171 = pfVar238[0x31];
              fVar172 = pfVar238[0x32];
              fVar173 = pfVar238[0x33];
              fVar174 = pfVar238[0x34];
              fVar175 = pfVar238[0x35];
              fVar176 = pfVar238[0x36];
              fVar177 = pfVar238[0x37];
              fVar178 = pfVar238[0x38];
              fVar179 = pfVar238[0x39];
              fVar180 = pfVar238[0x3a];
              fVar181 = pfVar238[0x3b];
              fVar182 = pfVar238[0x3c];
              fVar183 = pfVar238[0x3d];
              fVar184 = pfVar238[0x3e];
              fVar185 = pfVar238[0x3f];
              fVar261 = fVar275 + fVar141 + fVar261;
              fVar275 = fVar275 + pfVar230[7] + fVar244;
              in_register_000013dc = fVar244 + fVar254 + fVar275 + fVar254;
              pfVar230 = (float *)((long)pfVar225 + lVar236 + 0xa0);
              fVar254 = *pfVar230;
              fVar245 = pfVar230[1];
              fVar252 = pfVar230[2];
              fVar256 = pfVar230[3];
              fVar186 = pfVar230[4];
              fVar187 = pfVar230[5];
              fVar188 = pfVar230[6];
              in_register_000012dc =
                   pfVar238[7] + fVar274 + fVar246 + fVar134 + pfVar238[0x1f] + pfVar238[0x27];
              fVar210 = pfVar238[0x40];
              fVar211 = pfVar238[0x41];
              fVar212 = pfVar238[0x42];
              fVar213 = pfVar238[0x43];
              fVar214 = pfVar238[0x44];
              fVar215 = pfVar238[0x45];
              fVar216 = pfVar238[0x46];
              in_register_0000151c = pfVar238[0x47];
              fVar249 = pfVar2[7] + fVar141 + fVar248;
              in_register_0000149c = fVar249 + fVar259 + fVar246 + fVar240;
              in_register_0000135c = pfVar226[7] + fVar141 + fVar249 + fVar248 + fVar241;
              in_register_0000141c = fVar243 + fVar31 + fVar141 + pfVar230[7] + fVar244;
              pfVar226 = (float *)(lVar232 + 0x20 + lVar236);
              fVar31 = *pfVar226;
              fVar240 = pfVar226[1];
              fVar241 = pfVar226[2];
              fVar243 = pfVar226[3];
              fVar244 = pfVar226[4];
              fVar246 = pfVar226[5];
              fVar248 = pfVar226[6];
              fVar249 = pfVar226[7];
              pfVar226 = (float *)(lVar232 + 0x40 + lVar236);
              fVar247 = *pfVar226;
              fVar250 = pfVar226[1];
              fVar258 = pfVar226[2];
              fVar260 = pfVar226[3];
              fVar263 = pfVar226[4];
              fVar264 = pfVar226[5];
              fVar266 = pfVar226[6];
              in_register_0000145c = pfVar226[7];
              pfVar226 = (float *)(lVar232 + 0x60 + lVar236);
              fVar203 = *pfVar226;
              fVar204 = pfVar226[1];
              fVar205 = pfVar226[2];
              fVar206 = pfVar226[3];
              fVar207 = pfVar226[4];
              fVar208 = pfVar226[5];
              fVar209 = pfVar226[6];
              in_register_000014dc = pfVar226[7];
              pfVar226 = (float *)(lVar232 + lVar236);
              fVar189 = *pfVar226;
              fVar190 = pfVar226[1];
              fVar191 = pfVar226[2];
              fVar192 = pfVar226[3];
              fVar193 = pfVar226[4];
              fVar194 = pfVar226[5];
              fVar195 = pfVar226[6];
              in_register_0000155c = pfVar3[7] + fVar134;
              pfVar226 = (float *)(lVar232 + 0x80 + lVar236);
              fVar217 = *pfVar226;
              fVar218 = pfVar226[1];
              fVar219 = pfVar226[2];
              fVar220 = pfVar226[3];
              fVar221 = pfVar226[4];
              fVar222 = pfVar226[5];
              fVar223 = pfVar226[6];
              in_register_0000159c = pfVar226[7];
              in_register_0000139c =
                   in_register_000013dc + in_register_0000145c + pfVar3[7] + fVar261;
              pfVar226 = (float *)(lVar232 + 0xa0 + lVar236);
              fVar196 = *pfVar226;
              fVar197 = pfVar226[1];
              fVar198 = pfVar226[2];
              fVar199 = pfVar226[3];
              fVar200 = pfVar226[4];
              fVar201 = pfVar226[5];
              fVar202 = pfVar226[6];
              pfVar226 = (float *)((long)pfVar237 + lVar236);
              *pfVar226 = fVar149 * fVar210 + fVar135 * fVar170 + fVar142 * fVar178 +
                          fVar94 * fVar80 + fVar87 * fVar60 + fVar102 * fVar127 +
                          fVar39 * *pfVar4 + fVar267 + fVar10 * fVar46 + fVar17 * fVar53;
              pfVar226[1] = fVar150 * fVar211 + fVar136 * fVar171 + fVar143 * fVar179 +
                            fVar95 * fVar81 + fVar88 * fVar61 + fVar103 * fVar128 +
                            fVar40 * fVar67 + fVar268 + fVar11 * fVar47 + fVar18 * fVar54;
              pfVar226[2] = fVar151 * fVar212 + fVar137 * fVar172 + fVar144 * fVar180 +
                            fVar96 * fVar82 + fVar89 * fVar62 + fVar104 * fVar129 +
                            fVar41 * fVar68 + fVar269 + fVar12 * fVar48 + fVar19 * fVar55;
              pfVar226[3] = fVar152 * fVar213 + fVar253 * fVar173 + fVar145 * fVar181 +
                            fVar97 * fVar83 + fVar90 * fVar63 + fVar105 * fVar130 +
                            fVar42 * fVar69 + fVar270 + fVar13 * fVar49 + fVar20 * fVar56;
              pfVar226[4] = fVar153 * fVar214 + fVar138 * fVar174 + fVar146 * fVar182 +
                            fVar98 * fVar84 + fVar91 * fVar64 + fVar106 * fVar131 +
                            fVar43 * fVar70 + fVar271 + fVar14 * fVar50 + fVar21 * fVar57;
              pfVar226[5] = fVar154 * fVar215 + fVar139 * fVar175 + fVar147 * fVar183 +
                            fVar99 * fVar85 + fVar92 * fVar65 + fVar107 * fVar132 +
                            fVar44 * fVar71 + fVar272 + fVar15 * fVar51 + fVar22 * fVar58;
              pfVar226[6] = fVar155 * fVar216 + fVar140 * fVar176 + fVar148 * fVar184 +
                            fVar100 * fVar86 + fVar93 * fVar66 + fVar108 * fVar133 +
                            fVar45 * fVar72 + fVar273 + fVar16 * fVar52 + fVar23 * fVar59;
              pfVar226[7] = in_register_0000149c;
              pfVar226 = (float *)((long)pfVar237 + lVar236 + 0x20);
              *pfVar226 = fVar149 * fVar178 + fVar142 * fVar170 + fVar156 * fVar210 +
                          fVar94 * fVar60 + fVar102 * fVar80 + fVar109 * fVar127 +
                          fVar10 * fVar39 + fVar267 + fVar17 * fVar46 + fVar24 * fVar53;
              pfVar226[1] = fVar150 * fVar179 + fVar143 * fVar171 + fVar157 * fVar211 +
                            fVar95 * fVar61 + fVar103 * fVar81 + fVar110 * fVar128 +
                            fVar11 * fVar40 + fVar268 + fVar18 * fVar47 + fVar25 * fVar54;
              pfVar226[2] = fVar151 * fVar180 + fVar144 * fVar172 + fVar158 * fVar212 +
                            fVar96 * fVar62 + fVar104 * fVar82 + fVar111 * fVar129 +
                            fVar12 * fVar41 + fVar269 + fVar19 * fVar48 + fVar26 * fVar55;
              pfVar226[3] = fVar152 * fVar181 + fVar145 * fVar173 + fVar159 * fVar213 +
                            fVar97 * fVar63 + fVar105 * fVar83 + fVar255 * fVar130 +
                            fVar13 * fVar42 + fVar270 + fVar20 * fVar49 + fVar27 * fVar56;
              pfVar226[4] = fVar153 * fVar182 + fVar146 * fVar174 + fVar160 * fVar214 +
                            fVar98 * fVar64 + fVar106 * fVar84 + fVar257 * fVar131 +
                            fVar14 * fVar43 + fVar271 + fVar21 * fVar50 + fVar28 * fVar57;
              pfVar226[5] = fVar154 * fVar183 + fVar147 * fVar175 + fVar251 * fVar215 +
                            fVar99 * fVar65 + fVar107 * fVar85 + fVar112 * fVar132 +
                            fVar15 * fVar44 + fVar272 + fVar22 * fVar51 + fVar29 * fVar58;
              pfVar226[6] = fVar155 * fVar184 + fVar148 * fVar176 + fVar161 * fVar216 +
                            fVar100 * fVar66 + fVar108 * fVar86 + fVar113 * fVar133 +
                            fVar16 * fVar45 + fVar273 + fVar23 * fVar52 + fVar30 * fVar59;
              pfVar226[7] = in_register_0000135c;
              pfVar226 = (float *)((long)pfVar237 + lVar236 + 0x40);
              *pfVar226 = fVar156 * fVar178 + fVar149 * fVar170 + fVar210 * fVar162 +
                          fVar102 * fVar60 + fVar109 * fVar80 + fVar127 * fVar114 +
                          fVar17 * fVar39 + fVar267 + fVar24 * fVar46 + fVar32 * fVar53;
              pfVar226[1] = fVar157 * fVar179 + fVar150 * fVar171 + fVar211 * fVar163 +
                            fVar103 * fVar61 + fVar110 * fVar81 + fVar128 * fVar115 +
                            fVar18 * fVar40 + fVar268 + fVar25 * fVar47 + fVar33 * fVar54;
              pfVar226[2] = fVar158 * fVar180 + fVar151 * fVar172 + fVar212 * fVar164 +
                            fVar104 * fVar62 + fVar111 * fVar82 + fVar129 * fVar116 +
                            fVar19 * fVar41 + fVar269 + fVar26 * fVar48 + fVar34 * fVar55;
              pfVar226[3] = fVar159 * fVar181 + fVar152 * fVar173 + fVar213 * fVar165 +
                            fVar105 * fVar63 + fVar255 * fVar83 + fVar130 * fVar117 +
                            fVar20 * fVar42 + fVar270 + fVar27 * fVar49 + fVar35 * fVar56;
              pfVar226[4] = fVar160 * fVar182 + fVar153 * fVar174 + fVar214 * fVar166 +
                            fVar106 * fVar64 + fVar257 * fVar84 + fVar131 * fVar118 +
                            fVar21 * fVar43 + fVar271 + fVar28 * fVar50 + fVar36 * fVar57;
              pfVar226[5] = fVar251 * fVar183 + fVar154 * fVar175 + fVar215 * fVar167 +
                            fVar107 * fVar65 + fVar112 * fVar85 + fVar132 * fVar119 +
                            fVar22 * fVar44 + fVar272 + fVar29 * fVar51 + fVar37 * fVar58;
              pfVar226[6] = fVar161 * fVar184 + fVar155 * fVar176 + fVar216 * fVar168 +
                            fVar108 * fVar66 + fVar113 * fVar86 + fVar133 * fVar120 +
                            fVar23 * fVar45 + fVar273 + fVar30 * fVar52 + fVar38 * fVar59;
              pfVar226[7] = fVar259 + fVar141 + fVar169 + fVar242;
              pfVar226 = (float *)((long)pfVar237 + lVar236 + 0x60);
              *pfVar226 = fVar162 * fVar178 + fVar156 * fVar170 + fVar210 * fVar254 +
                          fVar114 * fVar80 + fVar109 * fVar60 + fVar265 * fVar127 +
                          fVar24 * fVar39 + fVar267 + fVar32 * fVar46 + fVar53 * fVar73;
              pfVar226[1] = fVar163 * fVar179 + fVar157 * fVar171 + fVar211 * fVar245 +
                            fVar115 * fVar81 + fVar110 * fVar61 + fVar121 * fVar128 +
                            fVar25 * fVar40 + fVar268 + fVar33 * fVar47 + fVar54 * fVar74;
              pfVar226[2] = fVar164 * fVar180 + fVar158 * fVar172 + fVar212 * fVar252 +
                            fVar116 * fVar82 + fVar111 * fVar62 + fVar122 * fVar129 +
                            fVar26 * fVar41 + fVar269 + fVar34 * fVar48 + fVar55 * fVar75;
              pfVar226[3] = fVar165 * fVar181 + fVar159 * fVar173 + fVar213 * fVar256 +
                            fVar117 * fVar83 + fVar255 * fVar63 + fVar123 * fVar130 +
                            fVar27 * fVar42 + fVar270 + fVar35 * fVar49 + fVar56 * fVar76;
              pfVar226[4] = fVar166 * fVar182 + fVar160 * fVar174 + fVar214 * fVar186 +
                            fVar118 * fVar84 + fVar257 * fVar64 + fVar124 * fVar131 +
                            fVar28 * fVar43 + fVar271 + fVar36 * fVar50 + fVar57 * fVar77;
              pfVar226[5] = fVar167 * fVar183 + fVar251 * fVar175 + fVar215 * fVar187 +
                            fVar119 * fVar85 + fVar112 * fVar65 + fVar125 * fVar132 +
                            fVar29 * fVar44 + fVar272 + fVar37 * fVar51 + fVar58 * fVar78;
              pfVar226[6] = fVar168 * fVar184 + fVar161 * fVar176 + fVar216 * fVar188 +
                            fVar120 * fVar86 + fVar113 * fVar66 + fVar126 * fVar133 +
                            fVar30 * fVar45 + fVar273 + fVar38 * fVar52 + fVar59 * fVar79;
              pfVar226[7] = in_register_0000141c;
              pfVar226 = (float *)((long)pfVar239 + lVar236);
              *pfVar226 = fVar170 * fVar189 + fVar31 * fVar178 + fVar247 * fVar210 +
                          fVar142 * fVar80 + fVar135 * fVar60 + fVar149 * fVar127 +
                          fVar87 * fVar39 + fVar267 + fVar94 * fVar46 + fVar102 * fVar53;
              pfVar226[1] = fVar171 * fVar190 + fVar240 * fVar179 + fVar250 * fVar211 +
                            fVar143 * fVar81 + fVar136 * fVar61 + fVar150 * fVar128 +
                            fVar88 * fVar40 + fVar268 + fVar95 * fVar47 + fVar103 * fVar54;
              pfVar226[2] = fVar172 * fVar191 + fVar241 * fVar180 + fVar258 * fVar212 +
                            fVar144 * fVar82 + fVar137 * fVar62 + fVar151 * fVar129 +
                            fVar89 * fVar41 + fVar269 + fVar96 * fVar48 + fVar104 * fVar55;
              pfVar226[3] = fVar173 * fVar192 + fVar243 * fVar181 + fVar260 * fVar213 +
                            fVar145 * fVar83 + fVar253 * fVar63 + fVar152 * fVar130 +
                            fVar90 * fVar42 + fVar270 + fVar97 * fVar49 + fVar105 * fVar56;
              pfVar226[4] = fVar174 * fVar193 + fVar244 * fVar182 + fVar263 * fVar214 +
                            fVar146 * fVar84 + fVar138 * fVar64 + fVar153 * fVar131 +
                            fVar91 * fVar43 + fVar271 + fVar98 * fVar50 + fVar106 * fVar57;
              pfVar226[5] = fVar175 * fVar194 + fVar246 * fVar183 + fVar264 * fVar215 +
                            fVar147 * fVar85 + fVar139 * fVar65 + fVar154 * fVar132 +
                            fVar92 * fVar44 + fVar272 + fVar99 * fVar51 + fVar107 * fVar58;
              pfVar226[6] = fVar176 * fVar195 + fVar248 * fVar184 + fVar266 * fVar216 +
                            fVar148 * fVar86 + fVar140 * fVar66 + fVar155 * fVar133 +
                            fVar93 * fVar45 + fVar273 + fVar100 * fVar52 + fVar108 * fVar59;
              pfVar226[7] = fVar134 + fVar249 + fVar185 + fVar261;
              pfVar226 = (float *)((long)pfVar239 + lVar236 + 0x20);
              *pfVar226 = fVar156 * fVar127 + fVar149 * fVar80 + fVar142 * fVar60 +
                          fVar102 * fVar46 + fVar109 * fVar53 + fVar94 * fVar39 + fVar267 +
                          fVar31 * fVar170 + fVar247 * fVar178 + fVar203 * fVar210;
              pfVar226[1] = fVar157 * fVar128 + fVar150 * fVar81 + fVar143 * fVar61 +
                            fVar103 * fVar47 + fVar110 * fVar54 + fVar95 * fVar40 + fVar268 +
                            fVar240 * fVar171 + fVar250 * fVar179 + fVar204 * fVar211;
              pfVar226[2] = fVar158 * fVar129 + fVar151 * fVar82 + fVar144 * fVar62 +
                            fVar104 * fVar48 + fVar111 * fVar55 + fVar96 * fVar41 + fVar269 +
                            fVar241 * fVar172 + fVar258 * fVar180 + fVar205 * fVar212;
              pfVar226[3] = fVar159 * fVar130 + fVar152 * fVar83 + fVar145 * fVar63 +
                            fVar105 * fVar49 + fVar255 * fVar56 + fVar97 * fVar42 + fVar270 +
                            fVar243 * fVar173 + fVar260 * fVar181 + fVar206 * fVar213;
              pfVar226[4] = fVar160 * fVar131 + fVar153 * fVar84 + fVar146 * fVar64 +
                            fVar106 * fVar50 + fVar257 * fVar57 + fVar98 * fVar43 + fVar271 +
                            fVar244 * fVar174 + fVar263 * fVar182 + fVar207 * fVar214;
              pfVar226[5] = fVar251 * fVar132 + fVar154 * fVar85 + fVar147 * fVar65 +
                            fVar107 * fVar51 + fVar112 * fVar58 + fVar99 * fVar44 + fVar272 +
                            fVar246 * fVar175 + fVar264 * fVar183 + fVar208 * fVar215;
              pfVar226[6] = fVar161 * fVar133 + fVar155 * fVar86 + fVar148 * fVar66 +
                            fVar108 * fVar52 + fVar113 * fVar59 + fVar100 * fVar45 + fVar273 +
                            fVar248 * fVar176 + fVar266 * fVar184 + fVar209 * fVar216;
              pfVar226[7] = fVar275 + fVar262 + fVar101 + fVar274 +
                            in_register_0000155c + fVar134 + fVar249;
              pfVar226 = (float *)((long)pfVar239 + lVar236 + 0x40);
              *pfVar226 = fVar149 * fVar60 + fVar156 * fVar80 + fVar127 * fVar162 +
                          fVar102 * fVar39 + fVar267 + fVar109 * fVar46 + fVar114 * fVar53 +
                          fVar217 * fVar210 + fVar247 * fVar170 + fVar203 * fVar178;
              pfVar226[1] = fVar150 * fVar61 + fVar157 * fVar81 + fVar128 * fVar163 +
                            fVar103 * fVar40 + fVar268 + fVar110 * fVar47 + fVar115 * fVar54 +
                            fVar218 * fVar211 + fVar250 * fVar171 + fVar204 * fVar179;
              pfVar226[2] = fVar151 * fVar62 + fVar158 * fVar82 + fVar129 * fVar164 +
                            fVar104 * fVar41 + fVar269 + fVar111 * fVar48 + fVar116 * fVar55 +
                            fVar219 * fVar212 + fVar258 * fVar172 + fVar205 * fVar180;
              pfVar226[3] = fVar152 * fVar63 + fVar159 * fVar83 + fVar130 * fVar165 +
                            fVar105 * fVar42 + fVar270 + fVar255 * fVar49 + fVar117 * fVar56 +
                            fVar220 * fVar213 + fVar260 * fVar173 + fVar206 * fVar181;
              pfVar226[4] = fVar153 * fVar64 + fVar160 * fVar84 + fVar131 * fVar166 +
                            fVar106 * fVar43 + fVar271 + fVar257 * fVar50 + fVar118 * fVar57 +
                            fVar221 * fVar214 + fVar263 * fVar174 + fVar207 * fVar182;
              pfVar226[5] = fVar154 * fVar65 + fVar251 * fVar85 + fVar132 * fVar167 +
                            fVar107 * fVar44 + fVar272 + fVar112 * fVar51 + fVar119 * fVar58 +
                            fVar222 * fVar215 + fVar264 * fVar175 + fVar208 * fVar183;
              pfVar226[6] = fVar155 * fVar66 + fVar161 * fVar86 + fVar133 * fVar168 +
                            fVar108 * fVar45 + fVar273 + fVar113 * fVar52 + fVar120 * fVar59 +
                            fVar223 * fVar216 + fVar266 * fVar176 + fVar209 * fVar184;
              pfVar226[7] = in_register_0000139c;
              pfVar226 = (float *)((long)pfVar239 + lVar236 + 0x60);
              *pfVar226 = fVar109 * fVar39 + fVar267 + fVar114 * fVar46 + fVar265 * fVar53 +
                          fVar127 * fVar254 + fVar156 * fVar60 + fVar162 * fVar80 +
                          fVar203 * fVar170 + fVar217 * fVar178 + fVar210 * fVar196;
              pfVar226[1] = fVar110 * fVar40 + fVar268 + fVar115 * fVar47 + fVar121 * fVar54 +
                            fVar128 * fVar245 + fVar157 * fVar61 + fVar163 * fVar81 +
                            fVar204 * fVar171 + fVar218 * fVar179 + fVar211 * fVar197;
              pfVar226[2] = fVar111 * fVar41 + fVar269 + fVar116 * fVar48 + fVar122 * fVar55 +
                            fVar129 * fVar252 + fVar158 * fVar62 + fVar164 * fVar82 +
                            fVar205 * fVar172 + fVar219 * fVar180 + fVar212 * fVar198;
              pfVar226[3] = fVar255 * fVar42 + fVar270 + fVar117 * fVar49 + fVar123 * fVar56 +
                            fVar130 * fVar256 + fVar159 * fVar63 + fVar165 * fVar83 +
                            fVar206 * fVar173 + fVar220 * fVar181 + fVar213 * fVar199;
              pfVar226[4] = fVar257 * fVar43 + fVar271 + fVar118 * fVar50 + fVar124 * fVar57 +
                            fVar131 * fVar186 + fVar160 * fVar64 + fVar166 * fVar84 +
                            fVar207 * fVar174 + fVar221 * fVar182 + fVar214 * fVar200;
              pfVar226[5] = fVar112 * fVar44 + fVar272 + fVar119 * fVar51 + fVar125 * fVar58 +
                            fVar132 * fVar187 + fVar251 * fVar65 + fVar167 * fVar85 +
                            fVar208 * fVar175 + fVar222 * fVar183 + fVar215 * fVar201;
              pfVar226[6] = fVar113 * fVar45 + fVar273 + fVar120 * fVar52 + fVar126 * fVar59 +
                            fVar133 * fVar188 + fVar161 * fVar66 + fVar168 * fVar86 +
                            fVar209 * fVar176 + fVar223 * fVar184 + fVar216 * fVar202;
              pfVar226[7] = in_register_000012dc + fVar177 + fVar185 + in_register_000013dc;
              iVar228 = iVar228 + 4;
              lVar236 = lVar236 + 0x80;
            } while (iVar228 < (int)uVar7);
            lVar232 = lVar232 + lVar236;
            pfVar225 = (float *)((long)pfVar225 + lVar236);
            pfVar224 = (float *)((long)pfVar224 + lVar236);
            pfVar229 = (float *)((long)pfVar229 + lVar236);
            pfVar239 = (float *)((long)pfVar239 + lVar236);
            pfVar237 = (float *)((long)pfVar237 + lVar236);
            uVar233 = uVar7 & 0xfffffffc;
          }
          if ((int)(uVar233 | 1) < (int)uVar7) {
            lVar236 = 0;
            uVar235 = uVar233;
            do {
              pfVar226 = (float *)((long)pfVar229 + lVar236 + 0x20);
              fVar10 = *pfVar226;
              fVar11 = pfVar226[1];
              fVar12 = pfVar226[2];
              fVar13 = pfVar226[3];
              fVar14 = pfVar226[4];
              fVar15 = pfVar226[5];
              fVar16 = pfVar226[6];
              fVar17 = pfVar226[7];
              pfVar226 = (float *)((long)pfVar229 + lVar236 + 0x40);
              fVar18 = *pfVar226;
              fVar19 = pfVar226[1];
              fVar20 = pfVar226[2];
              fVar21 = pfVar226[3];
              fVar22 = pfVar226[4];
              fVar23 = pfVar226[5];
              fVar24 = pfVar226[6];
              fVar25 = pfVar226[7];
              fVar26 = *pfVar238;
              fVar27 = pfVar238[1];
              fVar28 = pfVar238[2];
              fVar29 = pfVar238[3];
              fVar30 = pfVar238[4];
              fVar31 = pfVar238[5];
              fVar32 = pfVar238[6];
              fVar33 = pfVar238[8];
              fVar34 = pfVar238[9];
              fVar35 = pfVar238[10];
              fVar36 = pfVar238[0xb];
              fVar37 = pfVar238[0xc];
              fVar38 = pfVar238[0xd];
              fVar39 = pfVar238[0xe];
              fVar40 = pfVar238[0x10];
              fVar41 = pfVar238[0x11];
              fVar42 = pfVar238[0x12];
              fVar43 = pfVar238[0x13];
              fVar44 = pfVar238[0x14];
              fVar45 = pfVar238[0x15];
              fVar46 = pfVar238[0x16];
              fVar47 = pfVar238[0x18];
              fVar48 = pfVar238[0x19];
              fVar49 = pfVar238[0x1a];
              fVar50 = pfVar238[0x1b];
              fVar51 = pfVar238[0x1c];
              fVar52 = pfVar238[0x1d];
              fVar53 = pfVar238[0x1e];
              fVar54 = pfVar238[0x1f];
              pfVar3 = (float *)((long)pfVar229 + lVar236);
              fVar55 = pfVar3[1];
              fVar56 = pfVar3[2];
              fVar57 = pfVar3[3];
              fVar58 = pfVar3[4];
              fVar59 = pfVar3[5];
              fVar60 = pfVar3[6];
              fVar254 = fVar274 + in_register_000012dc;
              pfVar226 = (float *)((long)pfVar229 + lVar236 + 0x60);
              fVar61 = *pfVar226;
              fVar62 = pfVar226[1];
              fVar63 = pfVar226[2];
              fVar64 = pfVar226[3];
              fVar65 = pfVar226[4];
              fVar66 = pfVar226[5];
              fVar67 = pfVar226[6];
              fVar255 = fVar274 + in_register_000013dc + in_register_0000141c + fVar25;
              fVar68 = pfVar238[0x20];
              fVar69 = pfVar238[0x21];
              fVar70 = pfVar238[0x22];
              fVar71 = pfVar238[0x23];
              fVar72 = pfVar238[0x24];
              fVar73 = pfVar238[0x25];
              fVar74 = pfVar238[0x26];
              fVar75 = pfVar238[0x27];
              fVar76 = pfVar238[0x28];
              fVar77 = pfVar238[0x29];
              fVar78 = pfVar238[0x2a];
              fVar79 = pfVar238[0x2b];
              fVar80 = pfVar238[0x2c];
              fVar81 = pfVar238[0x2d];
              fVar82 = pfVar238[0x2e];
              fVar83 = pfVar238[0x2f];
              pfVar226 = (float *)((long)pfVar224 + lVar236);
              fVar84 = *pfVar226;
              fVar85 = pfVar226[1];
              fVar86 = pfVar226[2];
              fVar87 = pfVar226[3];
              fVar88 = pfVar226[4];
              fVar89 = pfVar226[5];
              fVar90 = pfVar226[6];
              pfVar230 = (float *)((long)pfVar224 + lVar236 + 0x20);
              fVar91 = *pfVar230;
              fVar92 = pfVar230[1];
              fVar93 = pfVar230[2];
              fVar94 = pfVar230[3];
              fVar95 = pfVar230[4];
              fVar96 = pfVar230[5];
              fVar97 = pfVar230[6];
              pfVar2 = (float *)((long)pfVar224 + lVar236 + 0x40);
              fVar98 = *pfVar2;
              fVar99 = pfVar2[1];
              fVar100 = pfVar2[2];
              fVar101 = pfVar2[3];
              fVar102 = pfVar2[4];
              fVar103 = pfVar2[5];
              fVar104 = pfVar2[6];
              pfVar2 = (float *)((long)pfVar224 + lVar236 + 0x60);
              fVar105 = *pfVar2;
              fVar106 = pfVar2[1];
              fVar107 = pfVar2[2];
              fVar108 = pfVar2[3];
              fVar109 = pfVar2[4];
              fVar110 = pfVar2[5];
              fVar111 = pfVar2[6];
              fVar252 = in_register_0000151c + in_register_0000159c + pfVar238[0xf];
              fVar253 = fVar255 + in_register_0000155c + in_register_0000159c + fVar252;
              fVar256 = pfVar226[7] + fVar274 + pfVar230[7] + fVar255;
              in_register_0000141c = fVar274 + pfVar238[7] + in_register_0000159c + pfVar238[0x17];
              fVar255 = pfVar238[0x30];
              fVar257 = pfVar238[0x31];
              fVar112 = pfVar238[0x32];
              fVar113 = pfVar238[0x33];
              fVar114 = pfVar238[0x34];
              fVar115 = pfVar238[0x35];
              fVar116 = pfVar238[0x36];
              in_register_0000135c = pfVar238[0x37];
              fVar117 = pfVar238[0x38];
              fVar118 = pfVar238[0x39];
              fVar119 = pfVar238[0x3a];
              fVar120 = pfVar238[0x3b];
              fVar265 = pfVar238[0x3c];
              fVar121 = pfVar238[0x3d];
              fVar122 = pfVar238[0x3e];
              fVar123 = pfVar238[0x3f];
              pfVar226 = (float *)((long)pfVar225 + lVar236);
              fVar124 = *pfVar226;
              fVar125 = pfVar226[1];
              fVar126 = pfVar226[2];
              fVar127 = pfVar226[3];
              fVar128 = pfVar226[4];
              fVar129 = pfVar226[5];
              fVar130 = pfVar226[6];
              pfVar230 = (float *)((long)pfVar225 + lVar236 + 0x20);
              fVar131 = *pfVar230;
              fVar132 = pfVar230[1];
              fVar133 = pfVar230[2];
              fVar134 = pfVar230[3];
              fVar135 = pfVar230[4];
              fVar136 = pfVar230[5];
              fVar137 = pfVar230[6];
              pfVar2 = (float *)((long)pfVar225 + lVar236 + 0x40);
              fVar172 = *pfVar2;
              fVar173 = pfVar2[1];
              fVar174 = pfVar2[2];
              fVar175 = pfVar2[3];
              fVar176 = pfVar2[4];
              fVar177 = pfVar2[5];
              fVar178 = pfVar2[6];
              in_register_000014dc = pfVar2[7];
              in_register_0000155c =
                   in_register_0000155c + in_register_0000159c + in_register_0000159c;
              in_register_0000145c = pfVar226[7] + pfVar230[7];
              fVar165 = pfVar238[0x40];
              fVar166 = pfVar238[0x41];
              fVar167 = pfVar238[0x42];
              fVar168 = pfVar238[0x43];
              fVar169 = pfVar238[0x44];
              fVar170 = pfVar238[0x45];
              fVar171 = pfVar238[0x46];
              in_register_0000149c = pfVar238[0x47];
              fVar245 = in_register_0000151c + in_register_0000159c + in_register_0000159c + fVar75;
              pfVar226 = (float *)((long)pfVar225 + lVar236 + 0x60);
              fVar179 = *pfVar226;
              fVar180 = pfVar226[1];
              fVar181 = pfVar226[2];
              fVar182 = pfVar226[3];
              fVar183 = pfVar226[4];
              fVar184 = pfVar226[5];
              fVar185 = pfVar226[6];
              in_register_0000151c = pfVar226[7];
              in_register_000012dc = fVar253 + in_register_0000155c + fVar245;
              in_register_0000139c = fVar256 + in_register_0000145c + fVar253;
              pfVar226 = (float *)(lVar232 + 0x20 + lVar236);
              fVar253 = *pfVar226;
              fVar138 = pfVar226[1];
              fVar139 = pfVar226[2];
              fVar140 = pfVar226[3];
              fVar141 = pfVar226[4];
              fVar142 = pfVar226[5];
              fVar143 = pfVar226[6];
              fVar144 = pfVar226[7];
              pfVar226 = (float *)(lVar232 + lVar236);
              fVar145 = *pfVar226;
              fVar146 = pfVar226[1];
              fVar147 = pfVar226[2];
              fVar148 = pfVar226[3];
              fVar149 = pfVar226[4];
              fVar150 = pfVar226[5];
              fVar151 = pfVar226[6];
              pfVar226 = (float *)(lVar232 + 0x40 + lVar236);
              fVar159 = *pfVar226;
              fVar160 = pfVar226[1];
              fVar251 = pfVar226[2];
              fVar161 = pfVar226[3];
              fVar162 = pfVar226[4];
              fVar163 = pfVar226[5];
              fVar164 = pfVar226[6];
              in_register_000013dc = pfVar226[7];
              pfVar226 = (float *)(lVar232 + 0x60 + lVar236);
              fVar152 = *pfVar226;
              fVar153 = pfVar226[1];
              fVar154 = pfVar226[2];
              fVar155 = pfVar226[3];
              fVar156 = pfVar226[4];
              fVar157 = pfVar226[5];
              fVar158 = pfVar226[6];
              pfVar226 = (float *)((long)pfVar237 + lVar236);
              *pfVar226 = fVar267 + fVar26 * *pfVar3 + fVar10 * fVar33 + fVar18 * fVar40 +
                          fVar84 * fVar47 + fVar91 * fVar68 + fVar98 * fVar76 +
                          fVar124 * fVar255 + fVar131 * fVar117 + fVar172 * fVar165;
              pfVar226[1] = fVar268 + fVar27 * fVar55 + fVar11 * fVar34 + fVar19 * fVar41 +
                            fVar85 * fVar48 + fVar92 * fVar69 + fVar99 * fVar77 +
                            fVar125 * fVar257 + fVar132 * fVar118 + fVar173 * fVar166;
              pfVar226[2] = fVar269 + fVar28 * fVar56 + fVar12 * fVar35 + fVar20 * fVar42 +
                            fVar86 * fVar49 + fVar93 * fVar70 + fVar100 * fVar78 +
                            fVar126 * fVar112 + fVar133 * fVar119 + fVar174 * fVar167;
              pfVar226[3] = fVar270 + fVar29 * fVar57 + fVar13 * fVar36 + fVar21 * fVar43 +
                            fVar87 * fVar50 + fVar94 * fVar71 + fVar101 * fVar79 +
                            fVar127 * fVar113 + fVar134 * fVar120 + fVar175 * fVar168;
              pfVar226[4] = fVar271 + fVar30 * fVar58 + fVar14 * fVar37 + fVar22 * fVar44 +
                            fVar88 * fVar51 + fVar95 * fVar72 + fVar102 * fVar80 +
                            fVar128 * fVar114 + fVar135 * fVar265 + fVar176 * fVar169;
              pfVar226[5] = fVar272 + fVar31 * fVar59 + fVar15 * fVar38 + fVar23 * fVar45 +
                            fVar89 * fVar52 + fVar96 * fVar73 + fVar103 * fVar81 +
                            fVar129 * fVar115 + fVar136 * fVar121 + fVar177 * fVar170;
              pfVar226[6] = fVar273 + fVar32 * fVar60 + fVar16 * fVar39 + fVar24 * fVar46 +
                            fVar90 * fVar53 + fVar97 * fVar74 + fVar104 * fVar82 +
                            fVar130 * fVar116 + fVar137 * fVar122 + fVar178 * fVar171;
              pfVar226[7] = fVar254 + fVar17 + fVar25 + fVar252 + fVar245;
              pfVar226 = (float *)((long)pfVar237 + lVar236 + 0x20);
              *pfVar226 = fVar267 + fVar10 * fVar26 + fVar18 * fVar33 + fVar40 * fVar61 +
                          fVar91 * fVar47 + fVar98 * fVar68 + fVar105 * fVar76 +
                          fVar131 * fVar255 + fVar172 * fVar117 + fVar179 * fVar165;
              pfVar226[1] = fVar268 + fVar11 * fVar27 + fVar19 * fVar34 + fVar41 * fVar62 +
                            fVar92 * fVar48 + fVar99 * fVar69 + fVar106 * fVar77 +
                            fVar132 * fVar257 + fVar173 * fVar118 + fVar180 * fVar166;
              pfVar226[2] = fVar269 + fVar12 * fVar28 + fVar20 * fVar35 + fVar42 * fVar63 +
                            fVar93 * fVar49 + fVar100 * fVar70 + fVar107 * fVar78 +
                            fVar133 * fVar112 + fVar174 * fVar119 + fVar181 * fVar167;
              pfVar226[3] = fVar270 + fVar13 * fVar29 + fVar21 * fVar36 + fVar43 * fVar64 +
                            fVar94 * fVar50 + fVar101 * fVar71 + fVar108 * fVar79 +
                            fVar134 * fVar113 + fVar175 * fVar120 + fVar182 * fVar168;
              pfVar226[4] = fVar271 + fVar14 * fVar30 + fVar22 * fVar37 + fVar44 * fVar65 +
                            fVar95 * fVar51 + fVar102 * fVar72 + fVar109 * fVar80 +
                            fVar135 * fVar114 + fVar176 * fVar265 + fVar183 * fVar169;
              pfVar226[5] = fVar272 + fVar15 * fVar31 + fVar23 * fVar38 + fVar45 * fVar66 +
                            fVar96 * fVar52 + fVar103 * fVar73 + fVar110 * fVar81 +
                            fVar136 * fVar115 + fVar177 * fVar121 + fVar184 * fVar170;
              pfVar226[6] = fVar273 + fVar16 * fVar32 + fVar24 * fVar39 + fVar46 * fVar67 +
                            fVar97 * fVar53 + fVar104 * fVar74 + fVar111 * fVar82 +
                            fVar137 * fVar116 + fVar178 * fVar122 + fVar185 * fVar171;
              pfVar226[7] = in_register_000012dc;
              pfVar226 = (float *)((long)pfVar239 + lVar236);
              *pfVar226 = fVar84 * fVar26 + fVar267 + fVar91 * fVar33 + fVar98 * fVar40 +
                          fVar124 * fVar47 + fVar131 * fVar68 + fVar172 * fVar76 +
                          fVar255 * fVar145 + fVar253 * fVar117 + fVar165 * fVar159;
              pfVar226[1] = fVar85 * fVar27 + fVar268 + fVar92 * fVar34 + fVar99 * fVar41 +
                            fVar125 * fVar48 + fVar132 * fVar69 + fVar173 * fVar77 +
                            fVar257 * fVar146 + fVar138 * fVar118 + fVar166 * fVar160;
              pfVar226[2] = fVar86 * fVar28 + fVar269 + fVar93 * fVar35 + fVar100 * fVar42 +
                            fVar126 * fVar49 + fVar133 * fVar70 + fVar174 * fVar78 +
                            fVar112 * fVar147 + fVar139 * fVar119 + fVar167 * fVar251;
              pfVar226[3] = fVar87 * fVar29 + fVar270 + fVar94 * fVar36 + fVar101 * fVar43 +
                            fVar127 * fVar50 + fVar134 * fVar71 + fVar175 * fVar79 +
                            fVar113 * fVar148 + fVar140 * fVar120 + fVar168 * fVar161;
              pfVar226[4] = fVar88 * fVar30 + fVar271 + fVar95 * fVar37 + fVar102 * fVar44 +
                            fVar128 * fVar51 + fVar135 * fVar72 + fVar176 * fVar80 +
                            fVar114 * fVar149 + fVar141 * fVar265 + fVar169 * fVar162;
              pfVar226[5] = fVar89 * fVar31 + fVar272 + fVar96 * fVar38 + fVar103 * fVar45 +
                            fVar129 * fVar52 + fVar136 * fVar73 + fVar177 * fVar81 +
                            fVar115 * fVar150 + fVar142 * fVar121 + fVar170 * fVar163;
              pfVar226[6] = fVar90 * fVar32 + fVar273 + fVar97 * fVar39 + fVar104 * fVar46 +
                            fVar130 * fVar53 + fVar137 * fVar74 + fVar178 * fVar82 +
                            fVar116 * fVar151 + fVar143 * fVar122 + fVar171 * fVar164;
              pfVar226[7] = in_register_0000139c + fVar256 + fVar144 + in_register_0000135c;
              pfVar226 = (float *)((long)pfVar239 + lVar236 + 0x20);
              *pfVar226 = fVar267 + fVar91 * fVar26 + fVar98 * fVar33 + fVar105 * fVar40 +
                          fVar131 * fVar47 + fVar172 * fVar68 + fVar179 * fVar76 +
                          fVar253 * fVar255 + fVar159 * fVar117 + fVar165 * fVar152;
              pfVar226[1] = fVar268 + fVar92 * fVar27 + fVar99 * fVar34 + fVar106 * fVar41 +
                            fVar132 * fVar48 + fVar173 * fVar69 + fVar180 * fVar77 +
                            fVar138 * fVar257 + fVar160 * fVar118 + fVar166 * fVar153;
              pfVar226[2] = fVar269 + fVar93 * fVar28 + fVar100 * fVar35 + fVar107 * fVar42 +
                            fVar133 * fVar49 + fVar174 * fVar70 + fVar181 * fVar78 +
                            fVar139 * fVar112 + fVar251 * fVar119 + fVar167 * fVar154;
              pfVar226[3] = fVar270 + fVar94 * fVar29 + fVar101 * fVar36 + fVar108 * fVar43 +
                            fVar134 * fVar50 + fVar175 * fVar71 + fVar182 * fVar79 +
                            fVar140 * fVar113 + fVar161 * fVar120 + fVar168 * fVar155;
              pfVar226[4] = fVar271 + fVar95 * fVar30 + fVar102 * fVar37 + fVar109 * fVar44 +
                            fVar135 * fVar51 + fVar176 * fVar72 + fVar183 * fVar80 +
                            fVar141 * fVar114 + fVar162 * fVar265 + fVar169 * fVar156;
              pfVar226[5] = fVar272 + fVar96 * fVar31 + fVar103 * fVar38 + fVar110 * fVar45 +
                            fVar136 * fVar52 + fVar177 * fVar73 + fVar184 * fVar81 +
                            fVar142 * fVar115 + fVar163 * fVar121 + fVar170 * fVar157;
              pfVar226[6] = fVar273 + fVar97 * fVar32 + fVar104 * fVar39 + fVar111 * fVar46 +
                            fVar137 * fVar53 + fVar178 * fVar74 + fVar185 * fVar82 +
                            fVar143 * fVar116 + fVar164 * fVar122 + fVar171 * fVar158;
              pfVar226[7] = in_register_0000141c + fVar54 + fVar75 + fVar83 +
                            in_register_0000135c + fVar123 + in_register_0000135c;
              uVar233 = uVar235 + 2;
              iVar228 = uVar235 + 3;
              lVar236 = lVar236 + 0x40;
              uVar235 = uVar233;
            } while (iVar228 < (int)uVar7);
            lVar232 = lVar232 + lVar236;
            pfVar225 = (float *)((long)pfVar225 + lVar236);
            pfVar224 = (float *)((long)pfVar224 + lVar236);
            pfVar229 = (float *)((long)pfVar229 + lVar236);
            pfVar239 = (float *)((long)pfVar239 + lVar236);
            pfVar237 = (float *)((long)pfVar237 + lVar236);
          }
          if ((int)uVar233 < (int)uVar7) {
            iVar228 = uVar7 - uVar233;
            lVar236 = 0;
            do {
              fVar10 = *pfVar238;
              fVar11 = pfVar238[1];
              fVar12 = pfVar238[2];
              fVar13 = pfVar238[3];
              fVar14 = pfVar238[4];
              fVar15 = pfVar238[5];
              fVar16 = pfVar238[6];
              fVar17 = pfVar238[7];
              fVar18 = pfVar238[8];
              fVar19 = pfVar238[9];
              fVar20 = pfVar238[10];
              fVar21 = pfVar238[0xb];
              fVar22 = pfVar238[0xc];
              fVar23 = pfVar238[0xd];
              fVar24 = pfVar238[0xe];
              fVar25 = pfVar238[0xf];
              fVar26 = pfVar238[0x10];
              fVar27 = pfVar238[0x11];
              fVar28 = pfVar238[0x12];
              fVar29 = pfVar238[0x13];
              fVar30 = pfVar238[0x14];
              fVar31 = pfVar238[0x15];
              fVar32 = pfVar238[0x16];
              fVar33 = pfVar238[0x17];
              pfVar5 = (float *)((long)pfVar229 + lVar236);
              fVar34 = pfVar5[1];
              fVar35 = pfVar5[2];
              fVar36 = pfVar5[3];
              fVar37 = pfVar5[4];
              fVar38 = pfVar5[5];
              fVar39 = pfVar5[6];
              fVar40 = pfVar238[0x18];
              fVar41 = pfVar238[0x19];
              fVar42 = pfVar238[0x1a];
              fVar43 = pfVar238[0x1b];
              fVar44 = pfVar238[0x1c];
              fVar45 = pfVar238[0x1d];
              fVar46 = pfVar238[0x1e];
              fVar47 = pfVar238[0x1f];
              pfVar230 = (float *)((long)pfVar229 + lVar236 + 0x20);
              fVar48 = pfVar230[1];
              fVar49 = pfVar230[2];
              fVar50 = pfVar230[3];
              fVar51 = pfVar230[4];
              fVar52 = pfVar230[5];
              fVar53 = pfVar230[6];
              pfVar2 = (float *)((long)pfVar229 + lVar236 + 0x40);
              fVar54 = pfVar2[1];
              fVar55 = pfVar2[2];
              fVar56 = pfVar2[3];
              fVar57 = pfVar2[4];
              fVar58 = pfVar2[5];
              fVar59 = pfVar2[6];
              fVar255 = in_register_0000135c + in_register_0000139c;
              fVar60 = pfVar238[0x20];
              fVar61 = pfVar238[0x21];
              fVar62 = pfVar238[0x22];
              fVar63 = pfVar238[0x23];
              fVar64 = pfVar238[0x24];
              fVar65 = pfVar238[0x25];
              fVar66 = pfVar238[0x26];
              fVar67 = pfVar238[0x27];
              fVar130 = pfVar238[0x28];
              fVar131 = pfVar238[0x29];
              fVar132 = pfVar238[0x2a];
              fVar133 = pfVar238[0x2b];
              fVar134 = pfVar238[0x2c];
              fVar135 = pfVar238[0x2d];
              fVar136 = pfVar238[0x2e];
              in_register_0000139c = pfVar238[0x2f];
              pfVar226 = (float *)((long)pfVar224 + lVar236);
              fVar68 = *pfVar226;
              fVar69 = pfVar226[1];
              fVar70 = pfVar226[2];
              fVar71 = pfVar226[3];
              fVar72 = pfVar226[4];
              fVar73 = pfVar226[5];
              fVar74 = pfVar226[6];
              pfVar3 = (float *)((long)pfVar224 + lVar236 + 0x20);
              fVar75 = *pfVar3;
              fVar76 = pfVar3[1];
              fVar77 = pfVar3[2];
              fVar78 = pfVar3[3];
              fVar79 = pfVar3[4];
              fVar80 = pfVar3[5];
              fVar81 = pfVar3[6];
              pfVar4 = (float *)((long)pfVar224 + lVar236 + 0x40);
              fVar82 = *pfVar4;
              fVar83 = pfVar4[1];
              fVar84 = pfVar4[2];
              fVar85 = pfVar4[3];
              fVar86 = pfVar4[4];
              fVar87 = pfVar4[5];
              fVar88 = pfVar4[6];
              fVar257 = in_register_0000149c + pfVar226[7];
              fVar89 = pfVar238[0x30];
              fVar90 = pfVar238[0x31];
              fVar91 = pfVar238[0x32];
              fVar92 = pfVar238[0x33];
              fVar93 = pfVar238[0x34];
              fVar94 = pfVar238[0x35];
              fVar95 = pfVar238[0x36];
              fVar96 = pfVar238[0x37];
              fVar97 = pfVar238[0x38];
              fVar98 = pfVar238[0x39];
              fVar99 = pfVar238[0x3a];
              fVar100 = pfVar238[0x3b];
              fVar101 = pfVar238[0x3c];
              fVar102 = pfVar238[0x3d];
              fVar103 = pfVar238[0x3e];
              fVar104 = pfVar238[0x3f];
              fVar137 = pfVar238[0x40];
              fVar253 = pfVar238[0x41];
              fVar138 = pfVar238[0x42];
              fVar139 = pfVar238[0x43];
              fVar140 = pfVar238[0x44];
              fVar141 = pfVar238[0x45];
              fVar142 = pfVar238[0x46];
              in_register_000013dc = pfVar238[0x47];
              pfVar226 = (float *)((long)pfVar225 + lVar236);
              fVar105 = *pfVar226;
              fVar106 = pfVar226[1];
              fVar107 = pfVar226[2];
              fVar108 = pfVar226[3];
              fVar109 = pfVar226[4];
              fVar110 = pfVar226[5];
              fVar111 = pfVar226[6];
              pfVar4 = (float *)((long)pfVar225 + lVar236 + 0x20);
              fVar143 = *pfVar4;
              fVar144 = pfVar4[1];
              fVar145 = pfVar4[2];
              fVar146 = pfVar4[3];
              fVar147 = pfVar4[4];
              fVar148 = pfVar4[5];
              fVar149 = pfVar4[6];
              in_register_0000145c = pfVar4[7];
              pfVar4 = (float *)((long)pfVar225 + lVar236 + 0x40);
              fVar150 = *pfVar4;
              fVar151 = pfVar4[1];
              fVar152 = pfVar4[2];
              fVar153 = pfVar4[3];
              fVar154 = pfVar4[4];
              fVar155 = pfVar4[5];
              fVar156 = pfVar4[6];
              in_register_0000149c = pfVar4[7];
              in_register_0000141c = in_register_000014dc + pfVar226[7];
              in_register_0000135c = in_register_0000141c + fVar67;
              in_register_000012dc =
                   fVar274 + in_register_000012dc + fVar255 + pfVar3[7] + fVar257 +
                   in_register_0000135c;
              pfVar226 = (float *)(lVar232 + lVar236);
              fVar255 = *pfVar226;
              fVar257 = pfVar226[1];
              fVar112 = pfVar226[2];
              fVar113 = pfVar226[3];
              fVar114 = pfVar226[4];
              fVar115 = pfVar226[5];
              fVar116 = pfVar226[6];
              pfVar226 = (float *)(lVar232 + 0x20 + lVar236);
              fVar117 = *pfVar226;
              fVar118 = pfVar226[1];
              fVar119 = pfVar226[2];
              fVar120 = pfVar226[3];
              fVar265 = pfVar226[4];
              fVar121 = pfVar226[5];
              fVar122 = pfVar226[6];
              pfVar226 = (float *)(lVar232 + 0x40 + lVar236);
              fVar123 = *pfVar226;
              fVar124 = pfVar226[1];
              fVar125 = pfVar226[2];
              fVar126 = pfVar226[3];
              fVar127 = pfVar226[4];
              fVar128 = pfVar226[5];
              fVar129 = pfVar226[6];
              pfVar226 = (float *)((long)pfVar237 + lVar236);
              *pfVar226 = fVar267 + fVar10 * *pfVar5 + fVar18 * *pfVar230 + fVar26 * *pfVar2 +
                          fVar82 * fVar130 + fVar68 * fVar40 + fVar75 * fVar60 +
                          fVar105 * fVar89 + fVar143 * fVar97 + fVar150 * fVar137;
              pfVar226[1] = fVar268 + fVar11 * fVar34 + fVar19 * fVar48 + fVar27 * fVar54 +
                            fVar83 * fVar131 + fVar69 * fVar41 + fVar76 * fVar61 +
                            fVar106 * fVar90 + fVar144 * fVar98 + fVar151 * fVar253;
              pfVar226[2] = fVar269 + fVar12 * fVar35 + fVar20 * fVar49 + fVar28 * fVar55 +
                            fVar84 * fVar132 + fVar70 * fVar42 + fVar77 * fVar62 +
                            fVar107 * fVar91 + fVar145 * fVar99 + fVar152 * fVar138;
              pfVar226[3] = fVar270 + fVar13 * fVar36 + fVar21 * fVar50 + fVar29 * fVar56 +
                            fVar85 * fVar133 + fVar71 * fVar43 + fVar78 * fVar63 +
                            fVar108 * fVar92 + fVar146 * fVar100 + fVar153 * fVar139;
              pfVar226[4] = fVar271 + fVar14 * fVar37 + fVar22 * fVar51 + fVar30 * fVar57 +
                            fVar86 * fVar134 + fVar72 * fVar44 + fVar79 * fVar64 +
                            fVar109 * fVar93 + fVar147 * fVar101 + fVar154 * fVar140;
              pfVar226[5] = fVar272 + fVar15 * fVar38 + fVar23 * fVar52 + fVar31 * fVar58 +
                            fVar87 * fVar135 + fVar73 * fVar45 + fVar80 * fVar65 +
                            fVar110 * fVar94 + fVar148 * fVar102 + fVar155 * fVar141;
              pfVar226[6] = fVar273 + fVar16 * fVar39 + fVar24 * fVar53 + fVar32 * fVar59 +
                            fVar88 * fVar136 + fVar74 * fVar46 + fVar81 * fVar66 +
                            fVar111 * fVar95 + fVar149 * fVar103 + fVar156 * fVar142;
              pfVar226[7] = in_register_000012dc;
              pfVar226 = (float *)((long)pfVar239 + lVar236);
              *pfVar226 = fVar267 + fVar68 * fVar10 + fVar75 * fVar18 + fVar82 * fVar26 +
                          fVar105 * fVar40 + fVar143 * fVar60 + fVar150 * fVar130 +
                          fVar89 * fVar255 + fVar97 * fVar117 + fVar137 * fVar123;
              pfVar226[1] = fVar268 + fVar69 * fVar11 + fVar76 * fVar19 + fVar83 * fVar27 +
                            fVar106 * fVar41 + fVar144 * fVar61 + fVar151 * fVar131 +
                            fVar90 * fVar257 + fVar98 * fVar118 + fVar253 * fVar124;
              pfVar226[2] = fVar269 + fVar70 * fVar12 + fVar77 * fVar20 + fVar84 * fVar28 +
                            fVar107 * fVar42 + fVar145 * fVar62 + fVar152 * fVar132 +
                            fVar91 * fVar112 + fVar99 * fVar119 + fVar138 * fVar125;
              pfVar226[3] = fVar270 + fVar71 * fVar13 + fVar78 * fVar21 + fVar85 * fVar29 +
                            fVar108 * fVar43 + fVar146 * fVar63 + fVar153 * fVar133 +
                            fVar92 * fVar113 + fVar100 * fVar120 + fVar139 * fVar126;
              pfVar226[4] = fVar271 + fVar72 * fVar14 + fVar79 * fVar22 + fVar86 * fVar30 +
                            fVar109 * fVar44 + fVar147 * fVar64 + fVar154 * fVar134 +
                            fVar93 * fVar114 + fVar101 * fVar265 + fVar140 * fVar127;
              pfVar226[5] = fVar272 + fVar73 * fVar15 + fVar80 * fVar23 + fVar87 * fVar31 +
                            fVar110 * fVar45 + fVar148 * fVar65 + fVar155 * fVar135 +
                            fVar94 * fVar115 + fVar102 * fVar121 + fVar141 * fVar128;
              pfVar226[6] = fVar273 + fVar74 * fVar16 + fVar81 * fVar24 + fVar88 * fVar32 +
                            fVar111 * fVar46 + fVar149 * fVar66 + fVar156 * fVar136 +
                            fVar95 * fVar116 + fVar103 * fVar122 + fVar142 * fVar129;
              pfVar226[7] = fVar274 + fVar17 + fVar25 + fVar33 +
                            fVar47 + fVar67 + in_register_0000135c + fVar96 + fVar104 + fVar104;
              lVar236 = lVar236 + 0x20;
              iVar228 = iVar228 + -1;
            } while (iVar228 != 0);
            lVar232 = lVar232 + lVar236;
            pfVar225 = (float *)((long)pfVar225 + lVar236);
            pfVar224 = (float *)((long)pfVar224 + lVar236);
            pfVar229 = (float *)((long)pfVar229 + lVar236);
            pfVar239 = (float *)((long)pfVar239 + lVar236);
            pfVar237 = (float *)((long)pfVar237 + lVar236);
          }
          pfVar229 = pfVar229 + lVar1;
          pfVar224 = pfVar224 + lVar1;
          pfVar225 = pfVar225 + lVar1;
          lVar232 = lVar232 + lVar1 * 4;
          pfVar237 = pfVar237 + (long)(int)uVar7 * 8;
          pfVar239 = pfVar239 + (long)(int)uVar7 * 8;
          iVar228 = iVar231 + 3;
          iVar231 = iVar231 + 2;
          uVar233 = uVar8 & 0xfffffffe;
        } while (iVar228 < (int)uVar8);
      }
      if ((int)uVar233 < (int)uVar8) {
        do {
          uVar235 = 0;
          if (3 < (int)uVar7) {
            iVar231 = 3;
            do {
              fVar10 = pfVar229[8];
              fVar11 = pfVar229[9];
              fVar12 = pfVar229[10];
              fVar13 = pfVar229[0xb];
              fVar14 = pfVar229[0xc];
              fVar15 = pfVar229[0xd];
              fVar16 = pfVar229[0xe];
              pfVar239 = pfVar229 + 0xf;
              fVar17 = pfVar229[0x10];
              fVar18 = pfVar229[0x11];
              fVar19 = pfVar229[0x12];
              fVar20 = pfVar229[0x13];
              fVar21 = pfVar229[0x14];
              fVar22 = pfVar229[0x15];
              fVar23 = pfVar229[0x16];
              pfVar226 = pfVar229 + 0x17;
              fVar24 = pfVar229[0x18];
              fVar25 = pfVar229[0x19];
              fVar26 = pfVar229[0x1a];
              fVar27 = pfVar229[0x1b];
              fVar28 = pfVar229[0x1c];
              fVar29 = pfVar229[0x1d];
              fVar30 = pfVar229[0x1e];
              pfVar230 = pfVar229 + 0x1f;
              fVar31 = *pfVar238;
              fVar32 = pfVar238[1];
              fVar33 = pfVar238[2];
              fVar34 = pfVar238[3];
              fVar35 = pfVar238[4];
              fVar36 = pfVar238[5];
              fVar37 = pfVar238[6];
              fVar38 = pfVar238[0x10];
              fVar39 = pfVar238[0x11];
              fVar40 = pfVar238[0x12];
              fVar41 = pfVar238[0x13];
              fVar42 = pfVar238[0x14];
              fVar43 = pfVar238[0x15];
              fVar44 = pfVar238[0x16];
              fVar45 = pfVar238[0x17];
              fVar46 = *pfVar229;
              fVar47 = pfVar229[1];
              fVar48 = pfVar229[2];
              fVar49 = pfVar229[3];
              fVar50 = pfVar229[4];
              fVar51 = pfVar229[5];
              fVar52 = pfVar229[6];
              fVar53 = pfVar229[0x28];
              fVar54 = pfVar229[0x29];
              fVar55 = pfVar229[0x2a];
              fVar56 = pfVar229[0x2b];
              fVar57 = pfVar229[0x2c];
              fVar58 = pfVar229[0x2d];
              fVar59 = pfVar229[0x2e];
              fVar60 = pfVar229[0x20];
              fVar61 = pfVar229[0x21];
              fVar62 = pfVar229[0x22];
              fVar63 = pfVar229[0x23];
              fVar64 = pfVar229[0x24];
              fVar65 = pfVar229[0x25];
              fVar66 = pfVar229[0x26];
              pfVar229 = pfVar229 + 0x20;
              fVar67 = pfVar238[8];
              fVar68 = pfVar238[9];
              fVar69 = pfVar238[10];
              fVar70 = pfVar238[0xb];
              fVar71 = pfVar238[0xc];
              fVar72 = pfVar238[0xd];
              fVar73 = pfVar238[0xe];
              fVar74 = pfVar238[0x18];
              fVar75 = pfVar238[0x19];
              fVar76 = pfVar238[0x1a];
              fVar77 = pfVar238[0x1b];
              fVar78 = pfVar238[0x1c];
              fVar79 = pfVar238[0x1d];
              fVar80 = pfVar238[0x1e];
              fVar81 = pfVar238[0x1f];
              fVar260 = in_register_0000149c + fVar274;
              fVar263 = in_register_000014dc + fVar274;
              fVar247 = fVar274 + in_register_0000139c + *pfVar239 + *pfVar226;
              fVar249 = in_register_0000151c + *pfVar230;
              fVar250 = pfVar238[0xf] + in_register_000013dc;
              fVar82 = pfVar238[0x20];
              fVar83 = pfVar238[0x21];
              fVar84 = pfVar238[0x22];
              fVar85 = pfVar238[0x23];
              fVar86 = pfVar238[0x24];
              fVar87 = pfVar238[0x25];
              fVar88 = pfVar238[0x26];
              fVar89 = pfVar238[0x28];
              fVar90 = pfVar238[0x29];
              fVar91 = pfVar238[0x2a];
              fVar92 = pfVar238[0x2b];
              fVar93 = pfVar238[0x2c];
              fVar94 = pfVar238[0x2d];
              fVar95 = pfVar238[0x2e];
              fVar96 = pfVar224[8];
              fVar97 = pfVar224[9];
              fVar98 = pfVar224[10];
              fVar99 = pfVar224[0xb];
              fVar100 = pfVar224[0xc];
              fVar101 = pfVar224[0xd];
              fVar102 = pfVar224[0xe];
              fVar103 = pfVar224[0xf];
              fVar104 = pfVar224[0x10];
              fVar105 = pfVar224[0x11];
              fVar106 = pfVar224[0x12];
              fVar107 = pfVar224[0x13];
              fVar108 = pfVar224[0x14];
              fVar109 = pfVar224[0x15];
              fVar110 = pfVar224[0x16];
              fVar111 = pfVar224[0x18];
              fVar255 = pfVar224[0x19];
              fVar257 = pfVar224[0x1a];
              fVar112 = pfVar224[0x1b];
              fVar113 = pfVar224[0x1c];
              fVar114 = pfVar224[0x1d];
              fVar115 = pfVar224[0x1e];
              fVar116 = pfVar224[0x20];
              fVar117 = pfVar224[0x21];
              fVar118 = pfVar224[0x22];
              fVar119 = pfVar224[0x23];
              fVar120 = pfVar224[0x24];
              fVar265 = pfVar224[0x25];
              fVar121 = pfVar224[0x26];
              fVar122 = pfVar224[0x27];
              fVar123 = *pfVar224;
              fVar124 = pfVar224[1];
              fVar125 = pfVar224[2];
              fVar126 = pfVar224[3];
              fVar127 = pfVar224[4];
              fVar128 = pfVar224[5];
              fVar129 = pfVar224[6];
              fVar264 = in_register_0000151c + fVar263;
              fVar266 = in_register_0000155c + in_register_0000151c;
              fVar130 = pfVar224[0x28];
              fVar131 = pfVar224[0x29];
              fVar132 = pfVar224[0x2a];
              fVar133 = pfVar224[0x2b];
              fVar134 = pfVar224[0x2c];
              fVar135 = pfVar224[0x2d];
              fVar136 = pfVar224[0x2e];
              pfVar224 = pfVar224 + 0x20;
              fVar137 = pfVar238[0x30];
              fVar253 = pfVar238[0x31];
              fVar138 = pfVar238[0x32];
              fVar139 = pfVar238[0x33];
              fVar140 = pfVar238[0x34];
              fVar141 = pfVar238[0x35];
              fVar142 = pfVar238[0x36];
              fVar143 = pfVar238[0x38];
              fVar144 = pfVar238[0x39];
              fVar145 = pfVar238[0x3a];
              fVar146 = pfVar238[0x3b];
              fVar147 = pfVar238[0x3c];
              fVar148 = pfVar238[0x3d];
              fVar149 = pfVar238[0x3e];
              fVar178 = pfVar238[0x40];
              fVar179 = pfVar238[0x41];
              fVar180 = pfVar238[0x42];
              fVar181 = pfVar238[0x43];
              fVar182 = pfVar238[0x44];
              fVar183 = pfVar238[0x45];
              fVar184 = pfVar238[0x46];
              in_register_0000135c = pfVar238[0x47];
              fVar150 = pfVar225[8];
              fVar151 = pfVar225[9];
              fVar152 = pfVar225[10];
              fVar153 = pfVar225[0xb];
              fVar154 = pfVar225[0xc];
              fVar155 = pfVar225[0xd];
              fVar156 = pfVar225[0xe];
              fVar185 = pfVar225[0x10];
              fVar254 = pfVar225[0x11];
              fVar245 = pfVar225[0x12];
              fVar252 = pfVar225[0x13];
              fVar256 = pfVar225[0x14];
              fVar186 = pfVar225[0x15];
              fVar187 = pfVar225[0x16];
              in_register_0000145c = pfVar225[0x17];
              fVar188 = pfVar225[0x18];
              fVar240 = pfVar225[0x19];
              fVar241 = pfVar225[0x1a];
              fVar243 = pfVar225[0x1b];
              fVar244 = pfVar225[0x1c];
              fVar246 = pfVar225[0x1d];
              fVar248 = pfVar225[0x1e];
              in_register_0000149c = pfVar225[0x1f];
              fVar157 = pfVar225[0x20];
              fVar158 = pfVar225[0x21];
              fVar159 = pfVar225[0x22];
              fVar160 = pfVar225[0x23];
              fVar251 = pfVar225[0x24];
              fVar161 = pfVar225[0x25];
              fVar162 = pfVar225[0x26];
              fVar163 = pfVar225[0x27];
              fVar164 = *pfVar225;
              fVar165 = pfVar225[1];
              fVar166 = pfVar225[2];
              fVar167 = pfVar225[3];
              fVar168 = pfVar225[4];
              fVar169 = pfVar225[5];
              fVar170 = pfVar225[6];
              in_register_0000141c = fVar264 + pfVar225[0xf];
              in_register_000014dc = fVar266 + fVar264;
              in_register_0000151c = in_register_0000155c + fVar266;
              fVar171 = pfVar225[0x28];
              fVar172 = pfVar225[0x29];
              fVar173 = pfVar225[0x2a];
              fVar174 = pfVar225[0x2b];
              fVar175 = pfVar225[0x2c];
              fVar176 = pfVar225[0x2d];
              fVar177 = pfVar225[0x2e];
              pfVar225 = pfVar225 + 0x20;
              in_register_0000139c = pfVar238[0x37] + pfVar238[0x3f];
              fVar258 = in_register_0000141c + pfVar238[0x3f];
              in_register_000013dc = in_register_000014dc + fVar258;
              in_register_000012dc =
                   fVar274 + pfVar238[7] + fVar250 + in_register_0000155c + fVar81 + pfVar238[0x27]
                   + in_register_0000155c + in_register_0000139c;
              *pfVar237 = fVar267 + fVar31 * fVar46 + fVar67 * fVar10 + fVar17 * fVar38 +
                          fVar74 * fVar123 + fVar96 * fVar82 + fVar104 * fVar89 +
                          fVar137 * fVar164 + fVar150 * fVar143 + fVar185 * fVar178;
              pfVar237[1] = fVar268 + fVar32 * fVar47 + fVar68 * fVar11 + fVar18 * fVar39 +
                            fVar75 * fVar124 + fVar97 * fVar83 + fVar105 * fVar90 +
                            fVar253 * fVar165 + fVar151 * fVar144 + fVar254 * fVar179;
              pfVar237[2] = fVar269 + fVar33 * fVar48 + fVar69 * fVar12 + fVar19 * fVar40 +
                            fVar76 * fVar125 + fVar98 * fVar84 + fVar106 * fVar91 +
                            fVar138 * fVar166 + fVar152 * fVar145 + fVar245 * fVar180;
              pfVar237[3] = fVar270 + fVar34 * fVar49 + fVar70 * fVar13 + fVar20 * fVar41 +
                            fVar77 * fVar126 + fVar99 * fVar85 + fVar107 * fVar92 +
                            fVar139 * fVar167 + fVar153 * fVar146 + fVar252 * fVar181;
              pfVar237[4] = fVar271 + fVar35 * fVar50 + fVar71 * fVar14 + fVar21 * fVar42 +
                            fVar78 * fVar127 + fVar100 * fVar86 + fVar108 * fVar93 +
                            fVar140 * fVar168 + fVar154 * fVar147 + fVar256 * fVar182;
              pfVar237[5] = fVar272 + fVar36 * fVar51 + fVar72 * fVar15 + fVar22 * fVar43 +
                            fVar79 * fVar128 + fVar101 * fVar87 + fVar109 * fVar94 +
                            fVar141 * fVar169 + fVar155 * fVar148 + fVar186 * fVar183;
              pfVar237[6] = fVar273 + fVar37 * fVar52 + fVar73 * fVar16 + fVar23 * fVar44 +
                            fVar80 * fVar129 + fVar102 * fVar88 + fVar110 * fVar95 +
                            fVar142 * fVar170 + fVar156 * fVar149 + fVar187 * fVar184;
              pfVar237[7] = fVar247 + fVar263 + fVar103 + fVar81 + fVar258;
              pfVar237[8] = fVar10 * fVar31 + fVar267 + fVar67 * fVar17 + fVar24 * fVar38 +
                            fVar96 * fVar74 + fVar104 * fVar82 + fVar111 * fVar89 +
                            fVar150 * fVar137 + fVar185 * fVar143 + fVar188 * fVar178;
              pfVar237[9] = fVar11 * fVar32 + fVar268 + fVar68 * fVar18 + fVar25 * fVar39 +
                            fVar97 * fVar75 + fVar105 * fVar83 + fVar255 * fVar90 +
                            fVar151 * fVar253 + fVar254 * fVar144 + fVar240 * fVar179;
              pfVar237[10] = fVar12 * fVar33 + fVar269 + fVar69 * fVar19 + fVar26 * fVar40 +
                             fVar98 * fVar76 + fVar106 * fVar84 + fVar257 * fVar91 +
                             fVar152 * fVar138 + fVar245 * fVar145 + fVar241 * fVar180;
              pfVar237[0xb] =
                   fVar13 * fVar34 + fVar270 + fVar70 * fVar20 + fVar27 * fVar41 +
                   fVar99 * fVar77 + fVar107 * fVar85 + fVar112 * fVar92 +
                   fVar153 * fVar139 + fVar252 * fVar146 + fVar243 * fVar181;
              pfVar237[0xc] =
                   fVar14 * fVar35 + fVar271 + fVar71 * fVar21 + fVar28 * fVar42 +
                   fVar100 * fVar78 + fVar108 * fVar86 + fVar113 * fVar93 +
                   fVar154 * fVar140 + fVar256 * fVar147 + fVar244 * fVar182;
              pfVar237[0xd] =
                   fVar15 * fVar36 + fVar272 + fVar72 * fVar22 + fVar29 * fVar43 +
                   fVar101 * fVar79 + fVar109 * fVar87 + fVar114 * fVar94 +
                   fVar155 * fVar141 + fVar186 * fVar148 + fVar246 * fVar183;
              pfVar237[0xe] =
                   fVar16 * fVar37 + fVar273 + fVar73 * fVar23 + fVar30 * fVar44 +
                   fVar102 * fVar80 + fVar110 * fVar88 + fVar115 * fVar95 +
                   fVar156 * fVar142 + fVar187 * fVar149 + fVar248 * fVar184;
              pfVar237[0xf] = fVar260 + fVar249 + fVar264 + fVar247 + in_register_000013dc;
              pfVar237[0x10] =
                   fVar17 * fVar31 + fVar267 + fVar67 * fVar24 + fVar60 * fVar38 +
                   fVar104 * fVar74 + fVar111 * fVar82 + fVar116 * fVar89 +
                   fVar185 * fVar137 + fVar188 * fVar143 + fVar157 * fVar178;
              pfVar237[0x11] =
                   fVar18 * fVar32 + fVar268 + fVar68 * fVar25 + fVar61 * fVar39 +
                   fVar105 * fVar75 + fVar255 * fVar83 + fVar117 * fVar90 +
                   fVar254 * fVar253 + fVar240 * fVar144 + fVar158 * fVar179;
              pfVar237[0x12] =
                   fVar19 * fVar33 + fVar269 + fVar69 * fVar26 + fVar62 * fVar40 +
                   fVar106 * fVar76 + fVar257 * fVar84 + fVar118 * fVar91 +
                   fVar245 * fVar138 + fVar241 * fVar145 + fVar159 * fVar180;
              pfVar237[0x13] =
                   fVar20 * fVar34 + fVar270 + fVar70 * fVar27 + fVar63 * fVar41 +
                   fVar107 * fVar77 + fVar112 * fVar85 + fVar119 * fVar92 +
                   fVar252 * fVar139 + fVar243 * fVar146 + fVar160 * fVar181;
              pfVar237[0x14] =
                   fVar21 * fVar35 + fVar271 + fVar71 * fVar28 + fVar64 * fVar42 +
                   fVar108 * fVar78 + fVar113 * fVar86 + fVar120 * fVar93 +
                   fVar256 * fVar140 + fVar244 * fVar147 + fVar251 * fVar182;
              pfVar237[0x15] =
                   fVar22 * fVar36 + fVar272 + fVar72 * fVar29 + fVar65 * fVar43 +
                   fVar109 * fVar79 + fVar114 * fVar87 + fVar265 * fVar94 +
                   fVar186 * fVar141 + fVar246 * fVar148 + fVar161 * fVar183;
              pfVar237[0x16] =
                   fVar23 * fVar37 + fVar273 + fVar73 * fVar30 + fVar66 * fVar44 +
                   fVar110 * fVar80 + fVar115 * fVar88 + fVar121 * fVar95 +
                   fVar187 * fVar142 + fVar248 * fVar149 + fVar162 * fVar184;
              pfVar237[0x17] =
                   fVar263 + in_register_0000155c + fVar45 + fVar266 + fVar122 +
                   in_register_0000151c + fVar163;
              pfVar237[0x18] =
                   fVar267 + fVar24 * fVar31 + fVar60 * fVar67 + fVar38 * fVar53 +
                   fVar89 * fVar130 + fVar111 * fVar74 + fVar116 * fVar82 +
                   fVar178 * fVar171 + fVar188 * fVar137 + fVar157 * fVar143;
              pfVar237[0x19] =
                   fVar268 + fVar25 * fVar32 + fVar61 * fVar68 + fVar39 * fVar54 +
                   fVar90 * fVar131 + fVar255 * fVar75 + fVar117 * fVar83 +
                   fVar179 * fVar172 + fVar240 * fVar253 + fVar158 * fVar144;
              pfVar237[0x1a] =
                   fVar269 + fVar26 * fVar33 + fVar62 * fVar69 + fVar40 * fVar55 +
                   fVar91 * fVar132 + fVar257 * fVar76 + fVar118 * fVar84 +
                   fVar180 * fVar173 + fVar241 * fVar138 + fVar159 * fVar145;
              pfVar237[0x1b] =
                   fVar270 + fVar27 * fVar34 + fVar63 * fVar70 + fVar41 * fVar56 +
                   fVar92 * fVar133 + fVar112 * fVar77 + fVar119 * fVar85 +
                   fVar181 * fVar174 + fVar243 * fVar139 + fVar160 * fVar146;
              pfVar237[0x1c] =
                   fVar271 + fVar28 * fVar35 + fVar64 * fVar71 + fVar42 * fVar57 +
                   fVar93 * fVar134 + fVar113 * fVar78 + fVar120 * fVar86 +
                   fVar182 * fVar175 + fVar244 * fVar140 + fVar251 * fVar147;
              pfVar237[0x1d] =
                   fVar272 + fVar29 * fVar36 + fVar65 * fVar72 + fVar43 * fVar58 +
                   fVar94 * fVar135 + fVar114 * fVar79 + fVar265 * fVar87 +
                   fVar183 * fVar176 + fVar246 * fVar141 + fVar161 * fVar148;
              pfVar237[0x1e] =
                   fVar273 + fVar30 * fVar37 + fVar66 * fVar73 + fVar44 * fVar59 +
                   fVar95 * fVar136 + fVar115 * fVar80 + fVar121 * fVar88 +
                   fVar184 * fVar177 + fVar248 * fVar142 + fVar162 * fVar149;
              pfVar237[0x1f] = in_register_000012dc;
              pfVar237 = pfVar237 + 0x20;
              iVar231 = iVar231 + 4;
              uVar235 = uVar7 & 0xfffffffc;
            } while (iVar231 < (int)uVar7);
          }
          if ((int)(uVar235 | 1) < (int)uVar7) {
            lVar232 = 0;
            uVar234 = uVar235;
            do {
              pfVar239 = (float *)((long)pfVar229 + lVar232 + 0x20);
              fVar10 = *pfVar239;
              fVar11 = pfVar239[1];
              fVar12 = pfVar239[2];
              fVar13 = pfVar239[3];
              fVar14 = pfVar239[4];
              fVar15 = pfVar239[5];
              fVar16 = pfVar239[6];
              fVar17 = pfVar239[7];
              pfVar239 = (float *)((long)pfVar229 + lVar232 + 0x40);
              fVar18 = *pfVar239;
              fVar19 = pfVar239[1];
              fVar20 = pfVar239[2];
              fVar21 = pfVar239[3];
              fVar22 = pfVar239[4];
              fVar23 = pfVar239[5];
              fVar24 = pfVar239[6];
              fVar25 = pfVar239[7];
              fVar26 = *pfVar238;
              fVar27 = pfVar238[1];
              fVar28 = pfVar238[2];
              fVar29 = pfVar238[3];
              fVar30 = pfVar238[4];
              fVar31 = pfVar238[5];
              fVar32 = pfVar238[6];
              fVar33 = pfVar238[7];
              fVar34 = pfVar238[8];
              fVar35 = pfVar238[9];
              fVar36 = pfVar238[10];
              fVar37 = pfVar238[0xb];
              fVar38 = pfVar238[0xc];
              fVar39 = pfVar238[0xd];
              fVar40 = pfVar238[0xe];
              fVar41 = pfVar238[0xf];
              fVar42 = pfVar238[0x10];
              fVar43 = pfVar238[0x11];
              fVar44 = pfVar238[0x12];
              fVar45 = pfVar238[0x13];
              fVar46 = pfVar238[0x14];
              fVar47 = pfVar238[0x15];
              fVar48 = pfVar238[0x16];
              pfVar2 = (float *)((long)pfVar229 + lVar232);
              fVar49 = pfVar2[1];
              fVar50 = pfVar2[2];
              fVar51 = pfVar2[3];
              fVar52 = pfVar2[4];
              fVar53 = pfVar2[5];
              fVar54 = pfVar2[6];
              fVar55 = pfVar238[0x18];
              fVar56 = pfVar238[0x19];
              fVar57 = pfVar238[0x1a];
              fVar58 = pfVar238[0x1b];
              fVar59 = pfVar238[0x1c];
              fVar60 = pfVar238[0x1d];
              fVar61 = pfVar238[0x1e];
              fVar62 = pfVar238[0x1f];
              fVar251 = fVar274 + in_register_0000135c;
              pfVar239 = (float *)((long)pfVar229 + lVar232 + 0x60);
              fVar63 = *pfVar239;
              fVar64 = pfVar239[1];
              fVar65 = pfVar239[2];
              fVar66 = pfVar239[3];
              fVar67 = pfVar239[4];
              fVar68 = pfVar239[5];
              fVar69 = pfVar239[6];
              fVar70 = pfVar238[0x20];
              fVar71 = pfVar238[0x21];
              fVar72 = pfVar238[0x22];
              fVar73 = pfVar238[0x23];
              fVar74 = pfVar238[0x24];
              fVar75 = pfVar238[0x25];
              fVar76 = pfVar238[0x26];
              fVar77 = pfVar238[0x27];
              fVar78 = pfVar238[0x28];
              fVar79 = pfVar238[0x29];
              fVar80 = pfVar238[0x2a];
              fVar81 = pfVar238[0x2b];
              fVar82 = pfVar238[0x2c];
              fVar83 = pfVar238[0x2d];
              fVar84 = pfVar238[0x2e];
              fVar85 = pfVar238[0x2f];
              pfVar239 = (float *)((long)pfVar224 + lVar232 + 0x20);
              fVar86 = *pfVar239;
              fVar87 = pfVar239[1];
              fVar88 = pfVar239[2];
              fVar89 = pfVar239[3];
              fVar90 = pfVar239[4];
              fVar91 = pfVar239[5];
              fVar92 = pfVar239[6];
              fVar93 = pfVar239[7];
              pfVar239 = (float *)((long)pfVar224 + lVar232 + 0x40);
              fVar94 = *pfVar239;
              fVar95 = pfVar239[1];
              fVar96 = pfVar239[2];
              fVar97 = pfVar239[3];
              fVar98 = pfVar239[4];
              fVar99 = pfVar239[5];
              fVar100 = pfVar239[6];
              fVar101 = pfVar239[7];
              pfVar239 = (float *)((long)pfVar224 + lVar232);
              fVar102 = pfVar239[1];
              fVar103 = pfVar239[2];
              fVar104 = pfVar239[3];
              fVar105 = pfVar239[4];
              fVar106 = pfVar239[5];
              fVar107 = pfVar239[6];
              pfVar226 = (float *)((long)pfVar224 + lVar232 + 0x60);
              fVar108 = *pfVar226;
              fVar109 = pfVar226[1];
              fVar110 = pfVar226[2];
              fVar111 = pfVar226[3];
              fVar255 = pfVar226[4];
              fVar257 = pfVar226[5];
              fVar112 = pfVar226[6];
              fVar113 = pfVar238[0x30];
              fVar114 = pfVar238[0x31];
              fVar115 = pfVar238[0x32];
              fVar116 = pfVar238[0x33];
              fVar117 = pfVar238[0x34];
              fVar118 = pfVar238[0x35];
              fVar119 = pfVar238[0x36];
              fVar120 = pfVar238[0x37];
              fVar265 = pfVar238[0x38];
              fVar121 = pfVar238[0x39];
              fVar122 = pfVar238[0x3a];
              fVar123 = pfVar238[0x3b];
              fVar124 = pfVar238[0x3c];
              fVar125 = pfVar238[0x3d];
              fVar126 = pfVar238[0x3e];
              fVar127 = pfVar238[0x3f];
              fVar128 = pfVar238[0x40];
              fVar129 = pfVar238[0x41];
              fVar130 = pfVar238[0x42];
              fVar131 = pfVar238[0x43];
              fVar132 = pfVar238[0x44];
              fVar133 = pfVar238[0x45];
              fVar134 = pfVar238[0x46];
              pfVar230 = (float *)((long)pfVar225 + lVar232 + 0x20);
              fVar135 = *pfVar230;
              fVar136 = pfVar230[1];
              fVar137 = pfVar230[2];
              fVar253 = pfVar230[3];
              fVar138 = pfVar230[4];
              fVar139 = pfVar230[5];
              fVar140 = pfVar230[6];
              pfVar226 = (float *)((long)pfVar225 + lVar232 + 0x40);
              fVar154 = *pfVar226;
              fVar155 = pfVar226[1];
              fVar156 = pfVar226[2];
              fVar157 = pfVar226[3];
              fVar158 = pfVar226[4];
              fVar159 = pfVar226[5];
              fVar160 = pfVar226[6];
              in_register_0000139c = pfVar226[7];
              pfVar226 = (float *)((long)pfVar225 + lVar232);
              fVar141 = pfVar226[1];
              fVar142 = pfVar226[2];
              fVar143 = pfVar226[3];
              fVar144 = pfVar226[4];
              fVar145 = pfVar226[5];
              fVar146 = pfVar226[6];
              in_register_0000135c = in_register_000013dc + pfVar230[7];
              in_register_000012dc = in_register_0000135c + fVar127;
              pfVar230 = (float *)((long)pfVar225 + lVar232 + 0x60);
              fVar147 = *pfVar230;
              fVar148 = pfVar230[1];
              fVar149 = pfVar230[2];
              fVar150 = pfVar230[3];
              fVar151 = pfVar230[4];
              fVar152 = pfVar230[5];
              fVar153 = pfVar230[6];
              pfVar230 = (float *)((long)pfVar237 + lVar232);
              *pfVar230 = fVar267 + fVar26 * *pfVar2 + fVar10 * fVar34 + fVar18 * fVar42 +
                          fVar55 * *pfVar239 + fVar86 * fVar70 + fVar94 * fVar78 +
                          fVar113 * *pfVar226 + fVar135 * fVar265 + fVar154 * fVar128;
              pfVar230[1] = fVar268 + fVar27 * fVar49 + fVar11 * fVar35 + fVar19 * fVar43 +
                            fVar56 * fVar102 + fVar87 * fVar71 + fVar95 * fVar79 +
                            fVar114 * fVar141 + fVar136 * fVar121 + fVar155 * fVar129;
              pfVar230[2] = fVar269 + fVar28 * fVar50 + fVar12 * fVar36 + fVar20 * fVar44 +
                            fVar57 * fVar103 + fVar88 * fVar72 + fVar96 * fVar80 +
                            fVar115 * fVar142 + fVar137 * fVar122 + fVar156 * fVar130;
              pfVar230[3] = fVar270 + fVar29 * fVar51 + fVar13 * fVar37 + fVar21 * fVar45 +
                            fVar58 * fVar104 + fVar89 * fVar73 + fVar97 * fVar81 +
                            fVar116 * fVar143 + fVar253 * fVar123 + fVar157 * fVar131;
              pfVar230[4] = fVar271 + fVar30 * fVar52 + fVar14 * fVar38 + fVar22 * fVar46 +
                            fVar59 * fVar105 + fVar90 * fVar74 + fVar98 * fVar82 +
                            fVar117 * fVar144 + fVar138 * fVar124 + fVar158 * fVar132;
              pfVar230[5] = fVar272 + fVar31 * fVar53 + fVar15 * fVar39 + fVar23 * fVar47 +
                            fVar60 * fVar106 + fVar91 * fVar75 + fVar99 * fVar83 +
                            fVar118 * fVar145 + fVar139 * fVar125 + fVar159 * fVar133;
              pfVar230[6] = fVar273 + fVar32 * fVar54 + fVar16 * fVar40 + fVar24 * fVar48 +
                            fVar61 * fVar107 + fVar92 * fVar76 + fVar100 * fVar84 +
                            fVar119 * fVar146 + fVar140 * fVar126 + fVar160 * fVar134;
              pfVar230[7] = fVar251 + fVar17 + fVar25 + in_register_000013dc + fVar93 + fVar101 +
                            in_register_000012dc;
              pfVar239 = (float *)((long)pfVar237 + lVar232 + 0x20);
              *pfVar239 = fVar267 + fVar10 * fVar26 + fVar18 * fVar34 + fVar42 * fVar63 +
                          fVar86 * fVar55 + fVar94 * fVar70 + fVar78 * fVar108 +
                          fVar135 * fVar113 + fVar154 * fVar265 + fVar128 * fVar147;
              pfVar239[1] = fVar268 + fVar11 * fVar27 + fVar19 * fVar35 + fVar43 * fVar64 +
                            fVar87 * fVar56 + fVar95 * fVar71 + fVar79 * fVar109 +
                            fVar136 * fVar114 + fVar155 * fVar121 + fVar129 * fVar148;
              pfVar239[2] = fVar269 + fVar12 * fVar28 + fVar20 * fVar36 + fVar44 * fVar65 +
                            fVar88 * fVar57 + fVar96 * fVar72 + fVar80 * fVar110 +
                            fVar137 * fVar115 + fVar156 * fVar122 + fVar130 * fVar149;
              pfVar239[3] = fVar270 + fVar13 * fVar29 + fVar21 * fVar37 + fVar45 * fVar66 +
                            fVar89 * fVar58 + fVar97 * fVar73 + fVar81 * fVar111 +
                            fVar253 * fVar116 + fVar157 * fVar123 + fVar131 * fVar150;
              pfVar239[4] = fVar271 + fVar14 * fVar30 + fVar22 * fVar38 + fVar46 * fVar67 +
                            fVar90 * fVar59 + fVar98 * fVar74 + fVar82 * fVar255 +
                            fVar138 * fVar117 + fVar158 * fVar124 + fVar132 * fVar151;
              pfVar239[5] = fVar272 + fVar15 * fVar31 + fVar23 * fVar39 + fVar47 * fVar68 +
                            fVar91 * fVar60 + fVar99 * fVar75 + fVar83 * fVar257 +
                            fVar139 * fVar118 + fVar159 * fVar125 + fVar133 * fVar152;
              pfVar239[6] = fVar273 + fVar16 * fVar32 + fVar24 * fVar40 + fVar48 * fVar69 +
                            fVar92 * fVar61 + fVar100 * fVar76 + fVar84 * fVar112 +
                            fVar140 * fVar119 + fVar160 * fVar126 + fVar134 * fVar153;
              pfVar239[7] = fVar274 + fVar33 + fVar41 + fVar25 + fVar62 + fVar77 + fVar85 +
                            fVar120 + fVar127 + in_register_000012dc;
              uVar235 = uVar234 + 2;
              iVar231 = uVar234 + 3;
              lVar232 = lVar232 + 0x40;
              uVar234 = uVar235;
            } while (iVar231 < (int)uVar7);
            pfVar225 = (float *)((long)pfVar225 + lVar232);
            pfVar224 = (float *)((long)pfVar224 + lVar232);
            pfVar229 = (float *)((long)pfVar229 + lVar232);
            pfVar237 = (float *)((long)pfVar237 + lVar232);
          }
          if ((int)uVar235 < (int)uVar7) {
            iVar231 = uVar7 - uVar235;
            pfVar239 = pfVar224;
            pfVar226 = pfVar225;
            pfVar230 = pfVar229;
            do {
              pfVar229 = pfVar230 + 8;
              fVar10 = pfVar230[1];
              fVar11 = pfVar230[2];
              fVar12 = pfVar230[3];
              fVar13 = pfVar230[4];
              fVar14 = pfVar230[5];
              fVar15 = pfVar230[6];
              fVar16 = pfVar230[7];
              fVar17 = pfVar230[9];
              fVar18 = pfVar230[10];
              fVar19 = pfVar230[0xb];
              fVar20 = pfVar230[0xc];
              fVar21 = pfVar230[0xd];
              fVar22 = pfVar230[0xe];
              fVar23 = pfVar230[0xf];
              fVar24 = pfVar238[1];
              fVar25 = pfVar238[2];
              fVar26 = pfVar238[3];
              fVar27 = pfVar238[4];
              fVar28 = pfVar238[5];
              fVar29 = pfVar238[6];
              fVar30 = pfVar230[0x11];
              fVar31 = pfVar230[0x12];
              fVar32 = pfVar230[0x13];
              fVar33 = pfVar230[0x14];
              fVar34 = pfVar230[0x15];
              fVar35 = pfVar230[0x16];
              fVar36 = pfVar230[0x17];
              fVar37 = pfVar238[9];
              fVar38 = pfVar238[10];
              fVar39 = pfVar238[0xb];
              fVar40 = pfVar238[0xc];
              fVar41 = pfVar238[0xd];
              fVar42 = pfVar238[0xe];
              fVar43 = pfVar238[0x11];
              fVar44 = pfVar238[0x12];
              fVar45 = pfVar238[0x13];
              fVar46 = pfVar238[0x14];
              fVar47 = pfVar238[0x15];
              fVar48 = pfVar238[0x16];
              pfVar224 = pfVar239 + 8;
              fVar49 = pfVar239[1];
              fVar50 = pfVar239[2];
              fVar51 = pfVar239[3];
              fVar52 = pfVar239[4];
              fVar53 = pfVar239[5];
              fVar54 = pfVar239[6];
              fVar55 = pfVar239[7];
              fVar56 = pfVar239[9];
              fVar57 = pfVar239[10];
              fVar58 = pfVar239[0xb];
              fVar59 = pfVar239[0xc];
              fVar60 = pfVar239[0xd];
              fVar61 = pfVar239[0xe];
              fVar62 = pfVar239[0xf];
              fVar63 = pfVar239[0x11];
              fVar64 = pfVar239[0x12];
              fVar65 = pfVar239[0x13];
              fVar66 = pfVar239[0x14];
              fVar67 = pfVar239[0x15];
              fVar68 = pfVar239[0x16];
              fVar69 = pfVar238[0x19];
              fVar70 = pfVar238[0x1a];
              fVar71 = pfVar238[0x1b];
              fVar72 = pfVar238[0x1c];
              fVar73 = pfVar238[0x1d];
              fVar74 = pfVar238[0x1e];
              fVar75 = pfVar238[0x21];
              fVar76 = pfVar238[0x22];
              fVar77 = pfVar238[0x23];
              fVar78 = pfVar238[0x24];
              fVar79 = pfVar238[0x25];
              fVar80 = pfVar238[0x26];
              fVar81 = pfVar238[0x29];
              fVar82 = pfVar238[0x2a];
              fVar83 = pfVar238[0x2b];
              fVar84 = pfVar238[0x2c];
              fVar85 = pfVar238[0x2d];
              fVar86 = pfVar238[0x2e];
              pfVar225 = pfVar226 + 8;
              fVar87 = pfVar226[1];
              fVar88 = pfVar226[2];
              fVar89 = pfVar226[3];
              fVar90 = pfVar226[4];
              fVar91 = pfVar226[5];
              fVar92 = pfVar226[6];
              fVar93 = pfVar226[7];
              fVar94 = pfVar226[9];
              fVar95 = pfVar226[10];
              fVar96 = pfVar226[0xb];
              fVar97 = pfVar226[0xc];
              fVar98 = pfVar226[0xd];
              fVar99 = pfVar226[0xe];
              fVar100 = pfVar226[0xf];
              fVar101 = pfVar238[0x31];
              fVar102 = pfVar238[0x32];
              fVar103 = pfVar238[0x33];
              fVar104 = pfVar238[0x34];
              fVar105 = pfVar238[0x35];
              fVar106 = pfVar238[0x36];
              fVar107 = pfVar238[0x39];
              fVar108 = pfVar238[0x3a];
              fVar109 = pfVar238[0x3b];
              fVar110 = pfVar238[0x3c];
              fVar111 = pfVar238[0x3d];
              fVar255 = pfVar238[0x3e];
              fVar117 = pfVar226[0x11];
              fVar118 = pfVar226[0x12];
              fVar119 = pfVar226[0x13];
              fVar120 = pfVar226[0x14];
              fVar265 = pfVar226[0x15];
              fVar121 = pfVar226[0x16];
              in_register_000012dc = pfVar226[0x17];
              fVar257 = pfVar238[0x41];
              fVar112 = pfVar238[0x42];
              fVar113 = pfVar238[0x43];
              fVar114 = pfVar238[0x44];
              fVar115 = pfVar238[0x45];
              fVar116 = pfVar238[0x46];
              *pfVar237 = fVar267 + *pfVar230 * *pfVar238 +
                          pfVar230[8] * pfVar238[8] + pfVar230[0x10] * pfVar238[0x10] +
                          *pfVar239 * pfVar238[0x18] + pfVar239[8] * pfVar238[0x20] +
                          pfVar239[0x10] * pfVar238[0x28] +
                          *pfVar226 * pfVar238[0x30] + pfVar226[8] * pfVar238[0x38] +
                          pfVar226[0x10] * pfVar238[0x40];
              pfVar237[1] = fVar268 + fVar10 * fVar24 + fVar17 * fVar37 + fVar30 * fVar43 +
                            fVar49 * fVar69 + fVar56 * fVar75 + fVar63 * fVar81 +
                            fVar87 * fVar101 + fVar94 * fVar107 + fVar117 * fVar257;
              pfVar237[2] = fVar269 + fVar11 * fVar25 + fVar18 * fVar38 + fVar31 * fVar44 +
                            fVar50 * fVar70 + fVar57 * fVar76 + fVar64 * fVar82 +
                            fVar88 * fVar102 + fVar95 * fVar108 + fVar118 * fVar112;
              pfVar237[3] = fVar270 + fVar12 * fVar26 + fVar19 * fVar39 + fVar32 * fVar45 +
                            fVar51 * fVar71 + fVar58 * fVar77 + fVar65 * fVar83 +
                            fVar89 * fVar103 + fVar96 * fVar109 + fVar119 * fVar113;
              pfVar237[4] = fVar271 + fVar13 * fVar27 + fVar20 * fVar40 + fVar33 * fVar46 +
                            fVar52 * fVar72 + fVar59 * fVar78 + fVar66 * fVar84 +
                            fVar90 * fVar104 + fVar97 * fVar110 + fVar120 * fVar114;
              pfVar237[5] = fVar272 + fVar14 * fVar28 + fVar21 * fVar41 + fVar34 * fVar47 +
                            fVar53 * fVar73 + fVar60 * fVar79 + fVar67 * fVar85 +
                            fVar91 * fVar105 + fVar98 * fVar111 + fVar265 * fVar115;
              pfVar237[6] = fVar273 + fVar15 * fVar29 + fVar22 * fVar42 + fVar35 * fVar48 +
                            fVar54 * fVar74 + fVar61 * fVar80 + fVar68 * fVar86 +
                            fVar92 * fVar106 + fVar99 * fVar255 + fVar121 * fVar116;
              pfVar237[7] = fVar274 + fVar16 + fVar23 + fVar36 + fVar55 + fVar62 + fVar62 +
                            fVar93 + fVar100 + fVar100;
              pfVar237 = pfVar237 + 8;
              iVar231 = iVar231 + -1;
              pfVar239 = pfVar224;
              pfVar226 = pfVar225;
              pfVar230 = pfVar229;
            } while (iVar231 != 0);
          }
          pfVar229 = pfVar229 + 0x10;
          pfVar224 = pfVar224 + 0x10;
          pfVar225 = pfVar225 + 0x10;
          uVar233 = uVar233 + 1;
        } while (uVar233 != uVar8);
      }
      lVar227 = lVar227 + 1;
    } while (lVar227 != iVar6);
  }
  return;
}

Assistant:

static void convdw3x3s1_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;
    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        __m256 _bias0 = bias ? _mm256_loadu_ps((const float*)bias + g * 8) : _mm256_setzero_ps();

        const float* k0 = kernel.row(g);

        float* outptr0 = out.row(0);
        float* outptr1 = out.row(1);

        const Mat img0 = bottom_blob.channel(g);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);
        const float* r3 = img0.row(3);

        int i = 0;
        for (; i + 1 < outh; i += 2)
        {
            int j = 0;
            for (; j + 3 < outw; j += 4)
            {
                __m256 _sum00 = _bias0;
                __m256 _sum01 = _bias0;
                __m256 _sum02 = _bias0;
                __m256 _sum03 = _bias0;
                __m256 _sum10 = _bias0;
                __m256 _sum11 = _bias0;
                __m256 _sum12 = _bias0;
                __m256 _sum13 = _bias0;

                __m256 _k00 = _mm256_load_ps(k0);
                __m256 _k01 = _mm256_load_ps(k0 + 8);
                __m256 _k02 = _mm256_load_ps(k0 + 16);

                __m256 _r00 = _mm256_load_ps(r0);
                __m256 _r01 = _mm256_load_ps(r0 + 8);
                __m256 _r02 = _mm256_load_ps(r0 + 16);
                __m256 _r03 = _mm256_load_ps(r0 + 24);
                __m256 _r04 = _mm256_load_ps(r0 + 32);
                __m256 _r05 = _mm256_load_ps(r0 + 40);

                _sum00 = _mm256_comp_fmadd_ps(_k00, _r00, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k00, _r01, _sum01);
                _sum02 = _mm256_comp_fmadd_ps(_k00, _r02, _sum02);
                _sum03 = _mm256_comp_fmadd_ps(_k00, _r03, _sum03);
                _sum00 = _mm256_comp_fmadd_ps(_k01, _r01, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k01, _r02, _sum01);
                _sum02 = _mm256_comp_fmadd_ps(_k01, _r03, _sum02);
                _sum03 = _mm256_comp_fmadd_ps(_k01, _r04, _sum03);
                _sum00 = _mm256_comp_fmadd_ps(_k02, _r02, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k02, _r03, _sum01);
                _sum02 = _mm256_comp_fmadd_ps(_k02, _r04, _sum02);
                _sum03 = _mm256_comp_fmadd_ps(_k02, _r05, _sum03);

                __m256 _k10 = _mm256_load_ps(k0 + 24);
                __m256 _k11 = _mm256_load_ps(k0 + 32);
                __m256 _k12 = _mm256_load_ps(k0 + 40);

                __m256 _r10 = _mm256_load_ps(r1);
                __m256 _r11 = _mm256_load_ps(r1 + 8);
                __m256 _r12 = _mm256_load_ps(r1 + 16);
                __m256 _r13 = _mm256_load_ps(r1 + 24);
                __m256 _r14 = _mm256_load_ps(r1 + 32);
                __m256 _r15 = _mm256_load_ps(r1 + 40);

                _sum10 = _mm256_comp_fmadd_ps(_k00, _r10, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k00, _r11, _sum11);
                _sum12 = _mm256_comp_fmadd_ps(_k00, _r12, _sum12);
                _sum13 = _mm256_comp_fmadd_ps(_k00, _r13, _sum13);
                _sum00 = _mm256_comp_fmadd_ps(_k10, _r10, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k10, _r11, _sum01);
                _sum02 = _mm256_comp_fmadd_ps(_k10, _r12, _sum02);
                _sum03 = _mm256_comp_fmadd_ps(_k10, _r13, _sum03);

                _sum10 = _mm256_comp_fmadd_ps(_k01, _r11, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k01, _r12, _sum11);
                _sum12 = _mm256_comp_fmadd_ps(_k01, _r13, _sum12);
                _sum13 = _mm256_comp_fmadd_ps(_k01, _r14, _sum13);
                _sum00 = _mm256_comp_fmadd_ps(_k11, _r11, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k11, _r12, _sum01);
                _sum02 = _mm256_comp_fmadd_ps(_k11, _r13, _sum02);
                _sum03 = _mm256_comp_fmadd_ps(_k11, _r14, _sum03);

                _sum10 = _mm256_comp_fmadd_ps(_k02, _r12, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k02, _r13, _sum11);
                _sum12 = _mm256_comp_fmadd_ps(_k02, _r14, _sum12);
                _sum13 = _mm256_comp_fmadd_ps(_k02, _r15, _sum13);
                _sum00 = _mm256_comp_fmadd_ps(_k12, _r12, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k12, _r13, _sum01);
                _sum02 = _mm256_comp_fmadd_ps(_k12, _r14, _sum02);
                _sum03 = _mm256_comp_fmadd_ps(_k12, _r15, _sum03);

                __m256 _k20 = _mm256_load_ps(k0 + 48);
                __m256 _k21 = _mm256_load_ps(k0 + 56);
                __m256 _k22 = _mm256_load_ps(k0 + 64);

                __m256 _r20 = _mm256_load_ps(r2);
                __m256 _r21 = _mm256_load_ps(r2 + 8);
                __m256 _r22 = _mm256_load_ps(r2 + 16);
                __m256 _r23 = _mm256_load_ps(r2 + 24);
                __m256 _r24 = _mm256_load_ps(r2 + 32);
                __m256 _r25 = _mm256_load_ps(r2 + 40);

                _sum10 = _mm256_comp_fmadd_ps(_k10, _r20, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k10, _r21, _sum11);
                _sum12 = _mm256_comp_fmadd_ps(_k10, _r22, _sum12);
                _sum13 = _mm256_comp_fmadd_ps(_k10, _r23, _sum13);
                _sum00 = _mm256_comp_fmadd_ps(_k20, _r20, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k20, _r21, _sum01);
                _sum02 = _mm256_comp_fmadd_ps(_k20, _r22, _sum02);
                _sum03 = _mm256_comp_fmadd_ps(_k20, _r23, _sum03);

                _sum10 = _mm256_comp_fmadd_ps(_k11, _r21, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k11, _r22, _sum11);
                _sum12 = _mm256_comp_fmadd_ps(_k11, _r23, _sum12);
                _sum13 = _mm256_comp_fmadd_ps(_k11, _r24, _sum13);
                _sum00 = _mm256_comp_fmadd_ps(_k21, _r21, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k21, _r22, _sum01);
                _sum02 = _mm256_comp_fmadd_ps(_k21, _r23, _sum02);
                _sum03 = _mm256_comp_fmadd_ps(_k21, _r24, _sum03);

                _sum10 = _mm256_comp_fmadd_ps(_k12, _r22, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k12, _r23, _sum11);
                _sum12 = _mm256_comp_fmadd_ps(_k12, _r24, _sum12);
                _sum13 = _mm256_comp_fmadd_ps(_k12, _r25, _sum13);
                _sum00 = _mm256_comp_fmadd_ps(_k22, _r22, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k22, _r23, _sum01);
                _sum02 = _mm256_comp_fmadd_ps(_k22, _r24, _sum02);
                _sum03 = _mm256_comp_fmadd_ps(_k22, _r25, _sum03);

                __m256 _r30 = _mm256_load_ps(r3);
                __m256 _r31 = _mm256_load_ps(r3 + 8);
                __m256 _r32 = _mm256_load_ps(r3 + 16);
                __m256 _r33 = _mm256_load_ps(r3 + 24);
                __m256 _r34 = _mm256_load_ps(r3 + 32);
                __m256 _r35 = _mm256_load_ps(r3 + 40);

                _sum10 = _mm256_comp_fmadd_ps(_k20, _r30, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k20, _r31, _sum11);
                _sum12 = _mm256_comp_fmadd_ps(_k20, _r32, _sum12);
                _sum13 = _mm256_comp_fmadd_ps(_k20, _r33, _sum13);
                _sum10 = _mm256_comp_fmadd_ps(_k21, _r31, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k21, _r32, _sum11);
                _sum12 = _mm256_comp_fmadd_ps(_k21, _r33, _sum12);
                _sum13 = _mm256_comp_fmadd_ps(_k21, _r34, _sum13);
                _sum10 = _mm256_comp_fmadd_ps(_k22, _r32, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k22, _r33, _sum11);
                _sum12 = _mm256_comp_fmadd_ps(_k22, _r34, _sum12);
                _sum13 = _mm256_comp_fmadd_ps(_k22, _r35, _sum13);

                _mm256_store_ps(outptr0, _sum00);
                _mm256_store_ps(outptr0 + 8, _sum01);
                _mm256_store_ps(outptr0 + 16, _sum02);
                _mm256_store_ps(outptr0 + 24, _sum03);
                _mm256_store_ps(outptr1, _sum10);
                _mm256_store_ps(outptr1 + 8, _sum11);
                _mm256_store_ps(outptr1 + 16, _sum12);
                _mm256_store_ps(outptr1 + 24, _sum13);

                r0 += 32;
                r1 += 32;
                r2 += 32;
                r3 += 32;
                outptr0 += 32;
                outptr1 += 32;
            }
            for (; j + 1 < outw; j += 2)
            {
                __m256 _sum00 = _bias0;
                __m256 _sum01 = _bias0;
                __m256 _sum10 = _bias0;
                __m256 _sum11 = _bias0;

                __m256 _k00 = _mm256_load_ps(k0);
                __m256 _k01 = _mm256_load_ps(k0 + 8);
                __m256 _k02 = _mm256_load_ps(k0 + 16);

                __m256 _r00 = _mm256_load_ps(r0);
                __m256 _r01 = _mm256_load_ps(r0 + 8);
                __m256 _r02 = _mm256_load_ps(r0 + 16);
                __m256 _r03 = _mm256_load_ps(r0 + 24);

                _sum00 = _mm256_comp_fmadd_ps(_k00, _r00, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k00, _r01, _sum01);
                _sum00 = _mm256_comp_fmadd_ps(_k01, _r01, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k01, _r02, _sum01);
                _sum00 = _mm256_comp_fmadd_ps(_k02, _r02, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k02, _r03, _sum01);

                __m256 _k10 = _mm256_load_ps(k0 + 24);
                __m256 _k11 = _mm256_load_ps(k0 + 32);
                __m256 _k12 = _mm256_load_ps(k0 + 40);

                __m256 _r10 = _mm256_load_ps(r1);
                __m256 _r11 = _mm256_load_ps(r1 + 8);
                __m256 _r12 = _mm256_load_ps(r1 + 16);
                __m256 _r13 = _mm256_load_ps(r1 + 24);

                _sum00 = _mm256_comp_fmadd_ps(_k10, _r10, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k10, _r11, _sum01);
                _sum10 = _mm256_comp_fmadd_ps(_k00, _r10, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k00, _r11, _sum11);

                _sum00 = _mm256_comp_fmadd_ps(_k11, _r11, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k11, _r12, _sum01);
                _sum10 = _mm256_comp_fmadd_ps(_k01, _r11, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k01, _r12, _sum11);

                _sum00 = _mm256_comp_fmadd_ps(_k12, _r12, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k12, _r13, _sum01);
                _sum10 = _mm256_comp_fmadd_ps(_k02, _r12, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k02, _r13, _sum11);

                __m256 _k20 = _mm256_load_ps(k0 + 48);
                __m256 _k21 = _mm256_load_ps(k0 + 56);
                __m256 _k22 = _mm256_load_ps(k0 + 64);

                __m256 _r20 = _mm256_load_ps(r2);
                __m256 _r21 = _mm256_load_ps(r2 + 8);
                __m256 _r22 = _mm256_load_ps(r2 + 16);
                __m256 _r23 = _mm256_load_ps(r2 + 24);

                _sum00 = _mm256_comp_fmadd_ps(_k20, _r20, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k20, _r21, _sum01);
                _sum10 = _mm256_comp_fmadd_ps(_k10, _r20, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k10, _r21, _sum11);

                _sum00 = _mm256_comp_fmadd_ps(_k21, _r21, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k21, _r22, _sum01);
                _sum10 = _mm256_comp_fmadd_ps(_k11, _r21, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k11, _r22, _sum11);

                _sum00 = _mm256_comp_fmadd_ps(_k22, _r22, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k22, _r23, _sum01);
                _sum10 = _mm256_comp_fmadd_ps(_k12, _r22, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k12, _r23, _sum11);

                __m256 _r30 = _mm256_load_ps(r3);
                __m256 _r31 = _mm256_load_ps(r3 + 8);
                __m256 _r32 = _mm256_load_ps(r3 + 16);
                __m256 _r33 = _mm256_load_ps(r3 + 24);

                _sum10 = _mm256_comp_fmadd_ps(_k20, _r30, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k20, _r31, _sum11);
                _sum10 = _mm256_comp_fmadd_ps(_k21, _r31, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k21, _r32, _sum11);
                _sum10 = _mm256_comp_fmadd_ps(_k22, _r32, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k22, _r33, _sum11);

                _mm256_store_ps(outptr0, _sum00);
                _mm256_store_ps(outptr0 + 8, _sum01);
                _mm256_store_ps(outptr1, _sum10);
                _mm256_store_ps(outptr1 + 8, _sum11);

                r0 += 16;
                r1 += 16;
                r2 += 16;
                r3 += 16;
                outptr0 += 16;
                outptr1 += 16;
            }
            for (; j < outw; j++)
            {
                __m256 _sum0 = _bias0;
                __m256 _sum1 = _bias0;

                __m256 _k00 = _mm256_load_ps(k0);
                __m256 _k01 = _mm256_load_ps(k0 + 8);
                __m256 _k02 = _mm256_load_ps(k0 + 16);

                __m256 _r00 = _mm256_load_ps(r0);
                __m256 _r01 = _mm256_load_ps(r0 + 8);
                __m256 _r02 = _mm256_load_ps(r0 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);

                __m256 _k10 = _mm256_load_ps(k0 + 24);
                __m256 _k11 = _mm256_load_ps(k0 + 32);
                __m256 _k12 = _mm256_load_ps(k0 + 40);

                __m256 _r10 = _mm256_load_ps(r1);
                __m256 _r11 = _mm256_load_ps(r1 + 8);
                __m256 _r12 = _mm256_load_ps(r1 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k00, _r10, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k01, _r11, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k02, _r12, _sum1);

                __m256 _k20 = _mm256_load_ps(k0 + 48);
                __m256 _k21 = _mm256_load_ps(k0 + 56);
                __m256 _k22 = _mm256_load_ps(k0 + 64);

                __m256 _r20 = _mm256_load_ps(r2);
                __m256 _r21 = _mm256_load_ps(r2 + 8);
                __m256 _r22 = _mm256_load_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k10, _r20, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k11, _r21, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k12, _r22, _sum1);

                __m256 _r30 = _mm256_load_ps(r3);
                __m256 _r31 = _mm256_load_ps(r3 + 8);
                __m256 _r32 = _mm256_load_ps(r3 + 16);

                _sum1 = _mm256_comp_fmadd_ps(_k20, _r30, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k21, _r31, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k22, _r32, _sum1);

                _mm256_store_ps(outptr0, _sum0);
                _mm256_store_ps(outptr1, _sum1);

                r0 += 8;
                r1 += 8;
                r2 += 8;
                r3 += 8;
                outptr0 += 8;
                outptr1 += 8;
            }

            r0 += 2 * 8 + w * 8;
            r1 += 2 * 8 + w * 8;
            r2 += 2 * 8 + w * 8;
            r3 += 2 * 8 + w * 8;

            outptr0 += outw * 8;
            outptr1 += outw * 8;
        }
        for (; i < outh; i++)
        {
            int j = 0;
            for (; j + 3 < outw; j += 4)
            {
                __m256 _sum0 = _bias0;
                __m256 _sum1 = _bias0;
                __m256 _sum2 = _bias0;
                __m256 _sum3 = _bias0;

                __m256 _k00 = _mm256_load_ps(k0);
                __m256 _k01 = _mm256_load_ps(k0 + 8);
                __m256 _k02 = _mm256_load_ps(k0 + 16);

                __m256 _r00 = _mm256_load_ps(r0);
                __m256 _r01 = _mm256_load_ps(r0 + 8);
                __m256 _r02 = _mm256_load_ps(r0 + 16);
                __m256 _r03 = _mm256_load_ps(r0 + 24);
                __m256 _r04 = _mm256_load_ps(r0 + 32);
                __m256 _r05 = _mm256_load_ps(r0 + 40);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k00, _r01, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k00, _r02, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k00, _r03, _sum3);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k01, _r02, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k01, _r03, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k01, _r04, _sum3);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k02, _r03, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k02, _r04, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k02, _r05, _sum3);

                __m256 _k10 = _mm256_load_ps(k0 + 24);
                __m256 _k11 = _mm256_load_ps(k0 + 32);
                __m256 _k12 = _mm256_load_ps(k0 + 40);

                __m256 _r10 = _mm256_load_ps(r1);
                __m256 _r11 = _mm256_load_ps(r1 + 8);
                __m256 _r12 = _mm256_load_ps(r1 + 16);
                __m256 _r13 = _mm256_load_ps(r1 + 24);
                __m256 _r14 = _mm256_load_ps(r1 + 32);
                __m256 _r15 = _mm256_load_ps(r1 + 40);

                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k10, _r11, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k10, _r12, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k10, _r13, _sum3);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k11, _r12, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k11, _r13, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k11, _r14, _sum3);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k12, _r13, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k12, _r14, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k12, _r15, _sum3);

                __m256 _k20 = _mm256_load_ps(k0 + 48);
                __m256 _k21 = _mm256_load_ps(k0 + 56);
                __m256 _k22 = _mm256_load_ps(k0 + 64);

                __m256 _r20 = _mm256_load_ps(r2);
                __m256 _r21 = _mm256_load_ps(r2 + 8);
                __m256 _r22 = _mm256_load_ps(r2 + 16);
                __m256 _r23 = _mm256_load_ps(r2 + 24);
                __m256 _r24 = _mm256_load_ps(r2 + 32);
                __m256 _r25 = _mm256_load_ps(r2 + 40);

                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k20, _r21, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k20, _r22, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k20, _r23, _sum3);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k21, _r22, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k21, _r23, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k21, _r24, _sum3);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k22, _r23, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k22, _r24, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k22, _r25, _sum3);

                _mm256_store_ps(outptr0, _sum0);
                _mm256_store_ps(outptr0 + 8, _sum1);
                _mm256_store_ps(outptr0 + 16, _sum2);
                _mm256_store_ps(outptr0 + 24, _sum3);

                r0 += 32;
                r1 += 32;
                r2 += 32;
                outptr0 += 32;
            }
            for (; j + 1 < outw; j += 2)
            {
                __m256 _sum0 = _bias0;
                __m256 _sum1 = _bias0;

                __m256 _k00 = _mm256_load_ps(k0);
                __m256 _k01 = _mm256_load_ps(k0 + 8);
                __m256 _k02 = _mm256_load_ps(k0 + 16);

                __m256 _r00 = _mm256_load_ps(r0);
                __m256 _r01 = _mm256_load_ps(r0 + 8);
                __m256 _r02 = _mm256_load_ps(r0 + 16);
                __m256 _r03 = _mm256_load_ps(r0 + 24);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k00, _r01, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k01, _r02, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k02, _r03, _sum1);

                __m256 _k10 = _mm256_load_ps(k0 + 24);
                __m256 _k11 = _mm256_load_ps(k0 + 32);
                __m256 _k12 = _mm256_load_ps(k0 + 40);

                __m256 _r10 = _mm256_load_ps(r1);
                __m256 _r11 = _mm256_load_ps(r1 + 8);
                __m256 _r12 = _mm256_load_ps(r1 + 16);
                __m256 _r13 = _mm256_load_ps(r1 + 24);

                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k10, _r11, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k11, _r12, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k12, _r13, _sum1);

                __m256 _k20 = _mm256_load_ps(k0 + 48);
                __m256 _k21 = _mm256_load_ps(k0 + 56);
                __m256 _k22 = _mm256_load_ps(k0 + 64);

                __m256 _r20 = _mm256_load_ps(r2);
                __m256 _r21 = _mm256_load_ps(r2 + 8);
                __m256 _r22 = _mm256_load_ps(r2 + 16);
                __m256 _r23 = _mm256_load_ps(r2 + 24);

                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k20, _r21, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k21, _r22, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k22, _r23, _sum1);

                _mm256_store_ps(outptr0, _sum0);
                _mm256_store_ps(outptr0 + 8, _sum1);

                r0 += 16;
                r1 += 16;
                r2 += 16;
                outptr0 += 16;
            }
            for (; j < outw; j++)
            {
                __m256 _sum0 = _bias0;

                __m256 _k00 = _mm256_load_ps(k0);
                __m256 _k01 = _mm256_load_ps(k0 + 8);
                __m256 _k02 = _mm256_load_ps(k0 + 16);

                __m256 _r00 = _mm256_load_ps(r0);
                __m256 _r01 = _mm256_load_ps(r0 + 8);
                __m256 _r02 = _mm256_load_ps(r0 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);

                __m256 _k10 = _mm256_load_ps(k0 + 24);
                __m256 _k11 = _mm256_load_ps(k0 + 32);
                __m256 _k12 = _mm256_load_ps(k0 + 40);

                __m256 _r10 = _mm256_load_ps(r1);
                __m256 _r11 = _mm256_load_ps(r1 + 8);
                __m256 _r12 = _mm256_load_ps(r1 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);

                __m256 _k20 = _mm256_load_ps(k0 + 48);
                __m256 _k21 = _mm256_load_ps(k0 + 56);
                __m256 _k22 = _mm256_load_ps(k0 + 64);

                __m256 _r20 = _mm256_load_ps(r2);
                __m256 _r21 = _mm256_load_ps(r2 + 8);
                __m256 _r22 = _mm256_load_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);

                _mm256_store_ps(outptr0, _sum0);

                r0 += 8;
                r1 += 8;
                r2 += 8;
                outptr0 += 8;
            }

            r0 += 2 * 8;
            r1 += 2 * 8;
            r2 += 2 * 8;
        }
    }
}